

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O2

void aom_lpf_horizontal_14_dual_sse2
               (uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0,uchar *_blimit1,
               uchar *_limit1,uchar *_thresh1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  byte bVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [15];
  unkuint9 Var65;
  undefined1 auVar66 [11];
  undefined1 auVar67 [15];
  unkuint9 Var68;
  undefined1 auVar69 [11];
  undefined1 auVar70 [15];
  unkuint9 Var71;
  undefined1 auVar72 [11];
  undefined1 auVar73 [13];
  undefined1 auVar74 [15];
  unkuint9 Var75;
  undefined1 auVar76 [11];
  undefined1 auVar77 [15];
  undefined1 auVar78 [11];
  undefined1 auVar79 [13];
  undefined1 auVar80 [15];
  undefined1 auVar81 [11];
  undefined1 auVar82 [15];
  undefined1 auVar83 [11];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  long lVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  byte bVar101;
  byte bVar105;
  byte bVar107;
  byte bVar109;
  byte bVar111;
  byte bVar113;
  byte bVar115;
  byte bVar117;
  undefined1 auVar103 [16];
  ushort uVar119;
  undefined1 auVar104 [16];
  ushort uVar120;
  undefined1 auVar121 [16];
  ushort uVar122;
  short sVar123;
  ushort uVar124;
  short sVar125;
  ushort uVar126;
  short sVar127;
  ushort uVar128;
  short sVar129;
  ushort uVar130;
  short sVar131;
  ushort uVar132;
  short sVar133;
  ushort uVar134;
  ushort uVar135;
  ushort uVar136;
  ushort uVar137;
  byte bVar138;
  byte bVar142;
  ushort uVar139;
  byte bVar143;
  byte bVar145;
  ushort uVar144;
  byte bVar146;
  byte bVar149;
  ushort uVar147;
  ushort uVar148;
  byte bVar150;
  byte bVar153;
  ushort uVar151;
  ushort uVar152;
  ushort uVar154;
  ushort uVar155;
  ushort uVar156;
  ushort uVar157;
  ushort uVar158;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  byte bVar159;
  byte bVar168;
  byte bVar169;
  byte bVar170;
  byte bVar171;
  byte bVar172;
  byte bVar173;
  byte bVar174;
  undefined1 auVar160 [16];
  undefined1 auVar167 [16];
  short sVar175;
  short sVar176;
  short sVar177;
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  short sVar184;
  short sVar185;
  short sVar186;
  short sVar187;
  short sVar188;
  short sVar189;
  short sVar190;
  short sVar191;
  short sVar192;
  short sVar193;
  short sVar194;
  short sVar195;
  short sVar196;
  short sVar197;
  short sVar198;
  short sVar199;
  short sVar200;
  short sVar201;
  undefined1 auVar178 [16];
  short sVar202;
  short sVar203;
  ushort uVar204;
  ushort uVar206;
  ushort uVar207;
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  char cVar214;
  char cVar215;
  undefined4 uVar209;
  char cVar217;
  char cVar218;
  char cVar219;
  char cVar220;
  ushort uVar221;
  undefined1 auVar211 [16];
  char cVar216;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  ushort uVar222;
  ushort uVar223;
  ushort uVar224;
  ushort uVar227;
  ushort uVar228;
  ushort uVar229;
  ushort uVar230;
  ushort uVar231;
  ushort uVar232;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  ushort uVar233;
  ushort uVar234;
  short sVar235;
  ushort uVar236;
  short sVar238;
  short sVar239;
  short sVar240;
  short sVar241;
  short sVar242;
  short sVar243;
  short sVar244;
  short sVar245;
  short sVar246;
  short sVar247;
  short sVar248;
  short sVar249;
  ushort uVar250;
  short sVar251;
  undefined1 auVar237 [16];
  byte bVar252;
  ushort uVar253;
  byte bVar263;
  short sVar264;
  byte bVar267;
  short sVar268;
  byte bVar271;
  short sVar272;
  byte bVar275;
  short sVar276;
  byte bVar280;
  short sVar281;
  byte bVar284;
  short sVar285;
  byte bVar288;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  byte bVar262;
  byte bVar266;
  byte bVar270;
  byte bVar274;
  byte bVar278;
  byte bVar279;
  byte bVar283;
  byte bVar287;
  byte bVar290;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  ushort uVar265;
  ushort uVar269;
  ushort uVar273;
  ushort uVar277;
  ushort uVar282;
  ushort uVar286;
  ushort uVar289;
  undefined1 auVar261 [16];
  short sVar291;
  ushort uVar292;
  short sVar297;
  short sVar299;
  short sVar301;
  short sVar303;
  short sVar305;
  short sVar307;
  undefined1 auVar293 [16];
  ushort uVar298;
  ushort uVar300;
  ushort uVar302;
  ushort uVar304;
  ushort uVar306;
  ushort uVar308;
  short sVar309;
  ushort uVar310;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  ushort uVar311;
  byte bVar314;
  byte bVar316;
  byte bVar318;
  byte bVar320;
  byte bVar322;
  undefined1 auVar312 [16];
  byte bVar315;
  byte bVar317;
  byte bVar319;
  byte bVar321;
  byte bVar323;
  byte bVar324;
  byte bVar325;
  undefined1 auVar313 [16];
  ushort uVar326;
  short sVar329;
  short sVar330;
  short sVar331;
  short sVar332;
  short sVar333;
  short sVar334;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ushort uStack_126;
  ushort uStack_124;
  ushort uStack_122;
  ushort uStack_120;
  ushort uStack_11e;
  ushort uStack_11c;
  ushort uStack_11a;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_100;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort uStack_c0;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  ushort uStack_66;
  ushort uStack_64;
  ushort uStack_62;
  ushort uStack_60;
  ushort uStack_5e;
  ushort uStack_5c;
  ushort uStack_5a;
  ushort uStack_56;
  ushort uStack_54;
  ushort uStack_52;
  ushort uStack_50;
  ushort uStack_4e;
  ushort uStack_4c;
  ushort uStack_4a;
  byte bVar102;
  byte bVar106;
  byte bVar108;
  byte bVar110;
  byte bVar112;
  byte bVar114;
  byte bVar116;
  byte bVar118;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined8 uVar210;
  
  bVar174 = *_blimit0;
  bVar252 = _blimit0[1];
  bVar262 = _blimit0[2];
  bVar263 = _blimit0[3];
  bVar266 = _blimit0[4];
  bVar267 = _blimit0[5];
  bVar270 = _blimit0[6];
  bVar271 = _blimit0[7];
  bVar274 = *_blimit1;
  bVar275 = _blimit1[1];
  bVar278 = _blimit1[2];
  bVar280 = _blimit1[3];
  bVar283 = _blimit1[4];
  bVar284 = _blimit1[5];
  bVar287 = _blimit1[6];
  bVar288 = _blimit1[7];
  bVar314 = *_limit0;
  bVar315 = _limit0[1];
  bVar316 = _limit0[2];
  bVar317 = _limit0[3];
  bVar318 = _limit0[4];
  bVar319 = _limit0[5];
  bVar320 = _limit0[6];
  bVar321 = _limit0[7];
  bVar322 = *_limit1;
  bVar323 = _limit1[1];
  bVar324 = _limit1[2];
  bVar325 = _limit1[3];
  bVar59 = _limit1[4];
  bVar60 = _limit1[5];
  bVar61 = _limit1[6];
  bVar62 = _limit1[7];
  bVar279 = *_thresh0;
  bVar159 = _thresh0[1];
  bVar168 = _thresh0[2];
  bVar169 = _thresh0[3];
  bVar170 = *_thresh1;
  bVar171 = _thresh1[1];
  bVar172 = _thresh1[2];
  bVar173 = _thresh1[3];
  lVar98 = (long)p;
  uVar1 = *(undefined8 *)(s + lVar98 * 4);
  uVar2 = *(undefined8 *)(s + lVar98 * -5);
  auVar141._8_8_ = uVar1;
  auVar141._0_8_ = uVar2;
  uVar3 = *(undefined8 *)(s + lVar98 * 3);
  uVar4 = *(undefined8 *)(s + lVar98 * -4);
  local_168._8_8_ = uVar3;
  local_168._0_8_ = uVar4;
  uVar5 = *(undefined8 *)(s + lVar98 * 2);
  uVar6 = *(undefined8 *)(s + lVar98 * -3);
  auVar328._8_8_ = uVar5;
  auVar328._0_8_ = uVar6;
  uVar7 = *(undefined8 *)(s + lVar98);
  uVar8 = *(undefined8 *)(s + lVar98 * -2);
  uVar9 = *(undefined8 *)(s + -lVar98);
  auVar258._8_8_ = uVar8;
  auVar258._0_8_ = uVar9;
  auVar312._8_8_ = uVar7;
  auVar312._0_8_ = uVar8;
  uVar11 = *(undefined8 *)s;
  auVar225._8_8_ = uVar11;
  auVar225._0_8_ = uVar9;
  local_178._8_8_ = *(undefined8 *)(s + lVar98 * 5);
  local_178._0_8_ = *(undefined8 *)(s + lVar98 * -6);
  auVar205._8_4_ = (int)uVar7;
  auVar205._0_8_ = uVar11;
  auVar205._12_4_ = (int)((ulong)uVar7 >> 0x20);
  auVar103 = psubusb(auVar312,auVar225);
  auVar178 = psubusb(auVar225,auVar312);
  auVar178 = auVar178 | auVar103;
  auVar103 = psubusb(auVar258,auVar205);
  auVar254 = psubusb(auVar205,auVar258);
  auVar254 = auVar254 | auVar103;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = auVar254._0_8_;
  bVar138 = auVar178[0];
  bVar102 = auVar178[8];
  bVar101 = (bVar102 < bVar138) * bVar138 | (bVar102 >= bVar138) * bVar102;
  bVar142 = auVar178[1];
  bVar106 = auVar178[9];
  bVar105 = (bVar106 < bVar142) * bVar142 | (bVar106 >= bVar142) * bVar106;
  bVar143 = auVar178[2];
  bVar108 = auVar178[10];
  bVar107 = (bVar108 < bVar143) * bVar143 | (bVar108 >= bVar143) * bVar108;
  bVar145 = auVar178[3];
  bVar110 = auVar178[0xb];
  bVar109 = (bVar110 < bVar145) * bVar145 | (bVar110 >= bVar145) * bVar110;
  bVar146 = auVar178[4];
  bVar112 = auVar178[0xc];
  bVar111 = (bVar112 < bVar146) * bVar146 | (bVar112 >= bVar146) * bVar112;
  bVar149 = auVar178[5];
  bVar114 = auVar178[0xd];
  bVar113 = (bVar114 < bVar149) * bVar149 | (bVar114 >= bVar149) * bVar114;
  bVar150 = auVar178[6];
  bVar116 = auVar178[0xe];
  bVar115 = (bVar116 < bVar150) * bVar150 | (bVar116 >= bVar150) * bVar116;
  bVar153 = auVar178[7];
  bVar118 = auVar178[0xf];
  bVar117 = (bVar118 < bVar153) * bVar153 | (bVar118 >= bVar153) * bVar118;
  uVar209 = CONCAT13(-((byte)((bVar109 < bVar169) * bVar109 | (bVar109 >= bVar169) * bVar169) ==
                      bVar109),
                     CONCAT12(-((byte)((bVar107 < bVar168) * bVar107 |
                                      (bVar107 >= bVar168) * bVar168) == bVar107),
                              CONCAT11(-((byte)((bVar105 < bVar159) * bVar105 |
                                               (bVar105 >= bVar159) * bVar159) == bVar105),
                                       -((byte)((bVar101 < bVar279) * bVar101 |
                                               (bVar101 >= bVar279) * bVar279) == bVar101))));
  uVar210 = CONCAT17(-((byte)((bVar117 < bVar173) * bVar117 | (bVar117 >= bVar173) * bVar173) ==
                      bVar117),
                     CONCAT16(-((byte)((bVar115 < bVar172) * bVar115 |
                                      (bVar115 >= bVar172) * bVar172) == bVar115),
                              CONCAT15(-((byte)((bVar113 < bVar171) * bVar113 |
                                               (bVar113 >= bVar171) * bVar171) == bVar113),
                                       CONCAT14(-((byte)((bVar111 < bVar170) * bVar111 |
                                                        (bVar111 >= bVar170) * bVar170) == bVar111),
                                                uVar209))));
  auVar178._8_4_ = uVar209;
  auVar178._0_8_ = uVar210;
  auVar178._12_4_ = (int)((ulong)uVar210 >> 0x20);
  auVar103 = paddusb(auVar293,auVar293);
  auVar255._0_2_ = auVar254._8_2_ >> 1;
  auVar255._2_2_ = auVar254._10_2_ >> 1;
  auVar255._4_2_ = auVar254._12_2_ >> 1;
  auVar255._6_2_ = auVar254._14_2_ >> 1;
  auVar255._8_8_ = 0;
  auVar103 = paddusb(auVar255 & _DAT_0042b930,auVar103);
  bVar279 = auVar103[0];
  bVar159 = auVar103[1];
  bVar168 = auVar103[2];
  bVar169 = auVar103[3];
  bVar170 = auVar103[4];
  bVar171 = auVar103[5];
  bVar172 = auVar103[6];
  bVar173 = auVar103[7];
  bVar101 = auVar103[8];
  bVar105 = auVar103[9];
  bVar107 = auVar103[10];
  bVar109 = auVar103[0xb];
  bVar111 = auVar103[0xc];
  bVar113 = auVar103[0xd];
  bVar115 = auVar103[0xe];
  bVar117 = auVar103[0xf];
  bVar279 = -((byte)((bVar279 < bVar174) * bVar279 | (bVar279 >= bVar174) * bVar174) == bVar279) ^
            0xff;
  bVar174 = -((byte)((bVar159 < bVar252) * bVar159 | (bVar159 >= bVar252) * bVar252) == bVar159) ^
            0xff;
  bVar252 = -((byte)((bVar168 < bVar262) * bVar168 | (bVar168 >= bVar262) * bVar262) == bVar168) ^
            0xff;
  bVar262 = -((byte)((bVar169 < bVar263) * bVar169 | (bVar169 >= bVar263) * bVar263) == bVar169) ^
            0xff;
  bVar263 = -((byte)((bVar170 < bVar274) * bVar170 | (bVar170 >= bVar274) * bVar274) == bVar170) ^
            0xff;
  bVar274 = -((byte)((bVar171 < bVar275) * bVar171 | (bVar171 >= bVar275) * bVar275) == bVar171) ^
            0xff;
  bVar275 = -((byte)((bVar172 < bVar278) * bVar172 | (bVar172 >= bVar278) * bVar278) == bVar172) ^
            0xff;
  bVar278 = -((byte)((bVar173 < bVar280) * bVar173 | (bVar173 >= bVar280) * bVar280) == bVar173) ^
            0xff;
  bVar266 = -((byte)((bVar101 < bVar266) * bVar101 | (bVar101 >= bVar266) * bVar266) == bVar101) ^
            0xff;
  bVar267 = -((byte)((bVar105 < bVar267) * bVar105 | (bVar105 >= bVar267) * bVar267) == bVar105) ^
            0xff;
  bVar270 = -((byte)((bVar107 < bVar270) * bVar107 | (bVar107 >= bVar270) * bVar270) == bVar107) ^
            0xff;
  bVar271 = -((byte)((bVar109 < bVar271) * bVar109 | (bVar109 >= bVar271) * bVar271) == bVar109) ^
            0xff;
  bVar280 = -((byte)((bVar111 < bVar283) * bVar111 | (bVar111 >= bVar283) * bVar283) == bVar111) ^
            0xff;
  bVar283 = -((byte)((bVar113 < bVar284) * bVar113 | (bVar113 >= bVar284) * bVar284) == bVar113) ^
            0xff;
  bVar284 = -((byte)((bVar115 < bVar287) * bVar115 | (bVar115 >= bVar287) * bVar287) == bVar115) ^
            0xff;
  bVar287 = -((byte)((bVar117 < bVar288) * bVar117 | (bVar117 >= bVar288) * bVar288) == bVar117) ^
            0xff;
  bVar159 = (bVar279 < bVar138) * bVar138 | (bVar279 >= bVar138) * bVar279;
  bVar168 = (bVar174 < bVar142) * bVar142 | (bVar174 >= bVar142) * bVar174;
  bVar169 = (bVar252 < bVar143) * bVar143 | (bVar252 >= bVar143) * bVar252;
  bVar170 = (bVar262 < bVar145) * bVar145 | (bVar262 >= bVar145) * bVar262;
  bVar171 = (bVar263 < bVar146) * bVar146 | (bVar263 >= bVar146) * bVar263;
  bVar172 = (bVar274 < bVar149) * bVar149 | (bVar274 >= bVar149) * bVar274;
  bVar173 = (bVar275 < bVar150) * bVar150 | (bVar275 >= bVar150) * bVar275;
  bVar101 = (bVar278 < bVar153) * bVar153 | (bVar278 >= bVar153) * bVar278;
  bVar105 = (bVar266 < bVar102) * bVar102 | (bVar266 >= bVar102) * bVar266;
  bVar107 = (bVar267 < bVar106) * bVar106 | (bVar267 >= bVar106) * bVar267;
  bVar109 = (bVar270 < bVar108) * bVar108 | (bVar270 >= bVar108) * bVar270;
  bVar111 = (bVar271 < bVar110) * bVar110 | (bVar271 >= bVar110) * bVar271;
  bVar113 = (bVar280 < bVar112) * bVar112 | (bVar280 >= bVar112) * bVar280;
  bVar115 = (bVar283 < bVar114) * bVar114 | (bVar283 >= bVar114) * bVar283;
  bVar117 = (bVar284 < bVar116) * bVar116 | (bVar284 >= bVar116) * bVar284;
  bVar174 = (bVar287 < bVar118) * bVar118 | (bVar287 >= bVar118) * bVar287;
  auVar103 = psubusb(auVar328,auVar312);
  auVar254 = psubusb(auVar312,auVar328);
  auVar254 = auVar254 | auVar103;
  auVar103 = psubusb(local_168,auVar328);
  auVar256 = psubusb(auVar328,local_168);
  auVar256 = auVar256 | auVar103;
  bVar279 = auVar254[0];
  bVar252 = auVar256[0];
  bVar252 = (bVar252 < bVar279) * bVar279 | (bVar252 >= bVar279) * bVar252;
  bVar279 = auVar254[1];
  bVar262 = auVar256[1];
  bVar262 = (bVar262 < bVar279) * bVar279 | (bVar262 >= bVar279) * bVar262;
  bVar279 = auVar254[2];
  bVar263 = auVar256[2];
  bVar263 = (bVar263 < bVar279) * bVar279 | (bVar263 >= bVar279) * bVar263;
  bVar279 = auVar254[3];
  bVar266 = auVar256[3];
  bVar266 = (bVar266 < bVar279) * bVar279 | (bVar266 >= bVar279) * bVar266;
  bVar279 = auVar254[4];
  bVar267 = auVar256[4];
  bVar267 = (bVar267 < bVar279) * bVar279 | (bVar267 >= bVar279) * bVar267;
  bVar279 = auVar254[5];
  bVar270 = auVar256[5];
  bVar270 = (bVar270 < bVar279) * bVar279 | (bVar270 >= bVar279) * bVar270;
  bVar279 = auVar254[6];
  bVar271 = auVar256[6];
  bVar271 = (bVar271 < bVar279) * bVar279 | (bVar271 >= bVar279) * bVar271;
  bVar279 = auVar254[7];
  bVar274 = auVar256[7];
  bVar274 = (bVar274 < bVar279) * bVar279 | (bVar274 >= bVar279) * bVar274;
  bVar279 = auVar254[8];
  bVar275 = auVar256[8];
  bVar275 = (bVar275 < bVar279) * bVar279 | (bVar275 >= bVar279) * bVar275;
  bVar279 = auVar254[9];
  bVar278 = auVar256[9];
  bVar278 = (bVar278 < bVar279) * bVar279 | (bVar278 >= bVar279) * bVar278;
  bVar279 = auVar254[10];
  bVar280 = auVar256[10];
  bVar280 = (bVar280 < bVar279) * bVar279 | (bVar280 >= bVar279) * bVar280;
  bVar279 = auVar254[0xb];
  bVar283 = auVar256[0xb];
  bVar283 = (bVar283 < bVar279) * bVar279 | (bVar283 >= bVar279) * bVar283;
  bVar279 = auVar254[0xc];
  bVar284 = auVar256[0xc];
  bVar284 = (bVar284 < bVar279) * bVar279 | (bVar284 >= bVar279) * bVar284;
  bVar279 = auVar254[0xd];
  bVar287 = auVar256[0xd];
  bVar287 = (bVar287 < bVar279) * bVar279 | (bVar287 >= bVar279) * bVar287;
  bVar279 = auVar254[0xe];
  bVar288 = auVar256[0xe];
  bVar290 = auVar256[0xf];
  bVar288 = (bVar288 < bVar279) * bVar279 | (bVar288 >= bVar279) * bVar288;
  bVar279 = auVar254[0xf];
  bVar290 = (bVar290 < bVar279) * bVar279 | (bVar290 >= bVar279) * bVar290;
  bVar252 = (bVar252 < bVar159) * bVar159 | (bVar252 >= bVar159) * bVar252;
  bVar262 = (bVar262 < bVar168) * bVar168 | (bVar262 >= bVar168) * bVar262;
  bVar263 = (bVar263 < bVar169) * bVar169 | (bVar263 >= bVar169) * bVar263;
  bVar266 = (bVar266 < bVar170) * bVar170 | (bVar266 >= bVar170) * bVar266;
  bVar267 = (bVar267 < bVar171) * bVar171 | (bVar267 >= bVar171) * bVar267;
  bVar270 = (bVar270 < bVar172) * bVar172 | (bVar270 >= bVar172) * bVar270;
  bVar271 = (bVar271 < bVar173) * bVar173 | (bVar271 >= bVar173) * bVar271;
  bVar274 = (bVar274 < bVar101) * bVar101 | (bVar274 >= bVar101) * bVar274;
  bVar173 = (bVar275 < bVar105) * bVar105 | (bVar275 >= bVar105) * bVar275;
  bVar279 = (bVar278 < bVar107) * bVar107 | (bVar278 >= bVar107) * bVar278;
  bVar159 = (bVar280 < bVar109) * bVar109 | (bVar280 >= bVar109) * bVar280;
  bVar168 = (bVar283 < bVar111) * bVar111 | (bVar283 >= bVar111) * bVar283;
  bVar169 = (bVar284 < bVar113) * bVar113 | (bVar284 >= bVar113) * bVar284;
  bVar170 = (bVar287 < bVar115) * bVar115 | (bVar287 >= bVar115) * bVar287;
  bVar171 = (bVar288 < bVar117) * bVar117 | (bVar288 >= bVar117) * bVar288;
  bVar172 = (bVar290 < bVar174) * bVar174 | (bVar290 >= bVar174) * bVar290;
  bVar101 = (bVar173 < bVar252) * bVar252 | (bVar173 >= bVar252) * bVar173;
  bVar105 = (bVar279 < bVar262) * bVar262 | (bVar279 >= bVar262) * bVar279;
  bVar107 = (bVar159 < bVar263) * bVar263 | (bVar159 >= bVar263) * bVar159;
  bVar109 = (bVar168 < bVar266) * bVar266 | (bVar168 >= bVar266) * bVar168;
  bVar111 = (bVar169 < bVar267) * bVar267 | (bVar169 >= bVar267) * bVar169;
  bVar113 = (bVar170 < bVar270) * bVar270 | (bVar170 >= bVar270) * bVar170;
  bVar115 = (bVar171 < bVar271) * bVar271 | (bVar171 >= bVar271) * bVar171;
  bVar117 = (bVar172 < bVar274) * bVar274 | (bVar172 >= bVar274) * bVar172;
  bVar173 = (bVar173 != 0) * bVar173;
  bVar279 = (bVar279 != 0) * bVar279;
  bVar159 = (bVar159 != 0) * bVar159;
  bVar168 = (bVar168 != 0) * bVar168;
  bVar169 = (bVar169 != 0) * bVar169;
  bVar170 = (bVar170 != 0) * bVar170;
  bVar171 = (bVar171 != 0) * bVar171;
  bVar172 = (bVar172 != 0) * bVar172;
  auVar103[0] = -((byte)((bVar101 < bVar314) * bVar101 | (bVar101 >= bVar314) * bVar314) == bVar101)
  ;
  auVar103[1] = -((byte)((bVar105 < bVar315) * bVar105 | (bVar105 >= bVar315) * bVar315) == bVar105)
  ;
  auVar103[2] = -((byte)((bVar107 < bVar316) * bVar107 | (bVar107 >= bVar316) * bVar316) == bVar107)
  ;
  auVar103[3] = -((byte)((bVar109 < bVar317) * bVar109 | (bVar109 >= bVar317) * bVar317) == bVar109)
  ;
  auVar103[4] = -((byte)((bVar111 < bVar322) * bVar111 | (bVar111 >= bVar322) * bVar322) == bVar111)
  ;
  auVar103[5] = -((byte)((bVar113 < bVar323) * bVar113 | (bVar113 >= bVar323) * bVar323) == bVar113)
  ;
  auVar103[6] = -((byte)((bVar115 < bVar324) * bVar115 | (bVar115 >= bVar324) * bVar324) == bVar115)
  ;
  auVar103[7] = -((byte)((bVar117 < bVar325) * bVar117 | (bVar117 >= bVar325) * bVar325) == bVar117)
  ;
  auVar103[8] = -((byte)((bVar173 < bVar318) * bVar173 | (bVar173 >= bVar318) * bVar318) == bVar173)
  ;
  auVar103[9] = -((byte)((bVar279 < bVar319) * bVar279 | (bVar279 >= bVar319) * bVar319) == bVar279)
  ;
  auVar103[10] = -((byte)((bVar159 < bVar320) * bVar159 | (bVar159 >= bVar320) * bVar320) == bVar159
                  );
  auVar103[0xb] =
       -((byte)((bVar168 < bVar321) * bVar168 | (bVar168 >= bVar321) * bVar321) == bVar168);
  auVar103[0xc] = -((byte)((bVar169 < bVar59) * bVar169 | (bVar169 >= bVar59) * bVar59) == bVar169);
  auVar103[0xd] = -((byte)((bVar170 < bVar60) * bVar170 | (bVar170 >= bVar60) * bVar60) == bVar170);
  auVar103[0xe] = -((byte)((bVar171 < bVar61) * bVar171 | (bVar171 >= bVar61) * bVar61) == bVar171);
  auVar103[0xf] = -((byte)((bVar172 < bVar62) * bVar172 | (bVar172 >= bVar62) * bVar62) == bVar172);
  auVar254 = psubsb(auVar258 ^ _DAT_0042cc00,auVar205 ^ _DAT_0042cc00);
  auVar256 = psubsb(~auVar178 & auVar254 >> 0x40,auVar254);
  auVar256 = psubsb(auVar256,auVar254);
  auVar256 = psubsb(auVar256,auVar254);
  auVar256 = auVar256 & auVar103;
  auVar254._0_8_ = auVar256._0_8_;
  auVar254._8_4_ = auVar256._0_4_;
  auVar254._12_4_ = auVar256._4_4_;
  auVar254 = paddsb(auVar254,_DAT_0046fe70);
  auVar211._0_5_ = (uint5)CONCAT12(auVar254[9],(ushort)auVar254[8]) << 8;
  auVar211[5] = auVar254[10];
  auVar211[6] = 0;
  auVar211[7] = auVar254[0xb];
  auVar211[8] = 0;
  auVar211[9] = auVar254[0xc];
  auVar211[10] = 0;
  auVar211[0xb] = auVar254[0xd];
  auVar211[0xc] = 0;
  auVar211[0xd] = auVar254[0xe];
  auVar211[0xe] = 0;
  auVar211[0xf] = auVar254[0xf];
  auVar166._0_14_ = auVar254._0_14_;
  auVar166[0xe] = auVar254[7];
  auVar166[0xf] = auVar254[7];
  auVar165._14_2_ = auVar166._14_2_;
  auVar165._0_13_ = auVar254._0_13_;
  auVar165[0xd] = auVar254[6];
  auVar164._13_3_ = auVar165._13_3_;
  auVar164._0_12_ = auVar254._0_12_;
  auVar164[0xc] = auVar254[6];
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._0_11_ = auVar254._0_11_;
  auVar163[0xb] = auVar254[5];
  auVar162._11_5_ = auVar163._11_5_;
  auVar162._0_10_ = auVar254._0_10_;
  auVar162[10] = auVar254[5];
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._0_9_ = auVar254._0_9_;
  auVar161[9] = auVar254[4];
  auVar256._9_7_ = auVar161._9_7_;
  auVar256._0_8_ = auVar254._0_8_;
  auVar256[8] = auVar254[4];
  auVar160._8_8_ = auVar256._8_8_;
  auVar160[7] = auVar254[3];
  auVar160[6] = auVar254[3];
  auVar160[5] = auVar254[2];
  auVar160[4] = auVar254[2];
  auVar160[3] = auVar254[1];
  auVar160[2] = auVar254[1];
  auVar160[0] = auVar254[0];
  auVar160[1] = auVar160[0];
  auVar254 = psraw(auVar160,0xb);
  auVar256 = psraw(auVar211,0xb);
  auVar254 = packsswb(auVar254,auVar256);
  auVar212[0] = auVar254[0] + '\x01';
  cVar214 = auVar254[1] + '\x01';
  cVar215 = auVar254[2] + '\x01';
  cVar216 = auVar254[3] + '\x01';
  cVar217 = auVar254[4] + '\x01';
  cVar218 = auVar254[5] + '\x01';
  cVar219 = auVar254[6] + '\x01';
  cVar220 = auVar254[7] + '\x01';
  auVar212._8_8_ =
       (undefined8)
       (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(cVar220,cVar220),cVar219),
                                                     cVar219),cVar218),cVar218),cVar217),
                 CONCAT11(cVar217,cVar220)) >> 8);
  auVar212[7] = cVar216;
  auVar212[6] = cVar216;
  auVar212[5] = cVar215;
  auVar212[4] = cVar215;
  auVar212[3] = cVar214;
  auVar212[2] = cVar214;
  auVar212[1] = auVar212[0];
  auVar256 = psraw(auVar212,9);
  auVar256 = packsswb(auVar256,auVar256);
  auVar257._8_8_ = SUB168(auVar256 & auVar178,8);
  auVar257._0_8_ = auVar254._8_8_;
  auVar167._0_8_ = auVar254._0_8_;
  auVar167._8_8_ = SUB168(auVar256 & auVar178,0);
  auVar178 = psubsb(auVar205 ^ _DAT_0042cc00,auVar167);
  auVar258 = paddsb(auVar257,auVar258 ^ _DAT_0042cc00);
  auVar295._0_8_ = SUB168(auVar258 ^ _DAT_0042cc00,0);
  auVar295._8_8_ = SUB168(auVar178 ^ _DAT_0042cc00,0);
  auVar260._8_8_ = SUB168(auVar178 ^ _DAT_0042cc00,8);
  auVar260._0_8_ = SUB168(auVar258 ^ _DAT_0042cc00,8);
  auVar178 = psubusb(auVar328,auVar225);
  auVar258 = psubusb(auVar225,auVar328);
  auVar258 = auVar258 | auVar178;
  auVar178 = psubusb(local_168,auVar225);
  auVar254 = psubusb(auVar225,local_168);
  auVar254 = auVar254 | auVar178;
  bVar279 = auVar258[0];
  bVar159 = auVar254[0];
  bVar159 = (bVar159 < bVar279) * bVar279 | (bVar159 >= bVar279) * bVar159;
  bVar279 = auVar258[1];
  bVar168 = auVar254[1];
  bVar168 = (bVar168 < bVar279) * bVar279 | (bVar168 >= bVar279) * bVar168;
  bVar279 = auVar258[2];
  bVar169 = auVar254[2];
  bVar169 = (bVar169 < bVar279) * bVar279 | (bVar169 >= bVar279) * bVar169;
  bVar279 = auVar258[3];
  bVar170 = auVar254[3];
  bVar170 = (bVar170 < bVar279) * bVar279 | (bVar170 >= bVar279) * bVar170;
  bVar279 = auVar258[4];
  bVar171 = auVar254[4];
  bVar171 = (bVar171 < bVar279) * bVar279 | (bVar171 >= bVar279) * bVar171;
  bVar279 = auVar258[5];
  bVar172 = auVar254[5];
  bVar172 = (bVar172 < bVar279) * bVar279 | (bVar172 >= bVar279) * bVar172;
  bVar279 = auVar258[6];
  bVar173 = auVar254[6];
  bVar173 = (bVar173 < bVar279) * bVar279 | (bVar173 >= bVar279) * bVar173;
  bVar279 = auVar258[7];
  bVar101 = auVar254[7];
  bVar101 = (bVar101 < bVar279) * bVar279 | (bVar101 >= bVar279) * bVar101;
  bVar279 = auVar258[8];
  bVar105 = auVar254[8];
  bVar105 = (bVar105 < bVar279) * bVar279 | (bVar105 >= bVar279) * bVar105;
  bVar279 = auVar258[9];
  bVar107 = auVar254[9];
  bVar107 = (bVar107 < bVar279) * bVar279 | (bVar107 >= bVar279) * bVar107;
  bVar279 = auVar258[10];
  bVar109 = auVar254[10];
  bVar109 = (bVar109 < bVar279) * bVar279 | (bVar109 >= bVar279) * bVar109;
  bVar279 = auVar258[0xb];
  bVar111 = auVar254[0xb];
  bVar111 = (bVar111 < bVar279) * bVar279 | (bVar111 >= bVar279) * bVar111;
  bVar279 = auVar258[0xc];
  bVar113 = auVar254[0xc];
  bVar113 = (bVar113 < bVar279) * bVar279 | (bVar113 >= bVar279) * bVar113;
  bVar279 = auVar258[0xd];
  bVar115 = auVar254[0xd];
  bVar115 = (bVar115 < bVar279) * bVar279 | (bVar115 >= bVar279) * bVar115;
  bVar279 = auVar258[0xe];
  bVar117 = auVar254[0xe];
  bVar174 = auVar254[0xf];
  bVar117 = (bVar117 < bVar279) * bVar279 | (bVar117 >= bVar279) * bVar117;
  bVar279 = auVar258[0xf];
  bVar174 = (bVar174 < bVar279) * bVar279 | (bVar174 >= bVar279) * bVar174;
  bVar138 = (bVar159 < bVar138) * bVar138 | (bVar159 >= bVar138) * bVar159;
  bVar142 = (bVar168 < bVar142) * bVar142 | (bVar168 >= bVar142) * bVar168;
  bVar143 = (bVar169 < bVar143) * bVar143 | (bVar169 >= bVar143) * bVar169;
  bVar145 = (bVar170 < bVar145) * bVar145 | (bVar170 >= bVar145) * bVar170;
  bVar146 = (bVar171 < bVar146) * bVar146 | (bVar171 >= bVar146) * bVar171;
  bVar149 = (bVar172 < bVar149) * bVar149 | (bVar172 >= bVar149) * bVar172;
  bVar150 = (bVar173 < bVar150) * bVar150 | (bVar173 >= bVar150) * bVar173;
  bVar153 = (bVar101 < bVar153) * bVar153 | (bVar101 >= bVar153) * bVar101;
  bVar173 = (bVar105 < bVar102) * bVar102 | (bVar105 >= bVar102) * bVar105;
  bVar172 = (bVar107 < bVar106) * bVar106 | (bVar107 >= bVar106) * bVar107;
  bVar171 = (bVar109 < bVar108) * bVar108 | (bVar109 >= bVar108) * bVar109;
  bVar279 = (bVar111 < bVar110) * bVar110 | (bVar111 >= bVar110) * bVar111;
  bVar170 = (bVar113 < bVar112) * bVar112 | (bVar113 >= bVar112) * bVar113;
  bVar169 = (bVar115 < bVar114) * bVar114 | (bVar115 >= bVar114) * bVar115;
  bVar168 = (bVar117 < bVar116) * bVar116 | (bVar117 >= bVar116) * bVar117;
  bVar159 = (bVar174 < bVar118) * bVar118 | (bVar174 >= bVar118) * bVar174;
  bVar138 = (bVar173 < bVar138) * bVar138 | (bVar173 >= bVar138) * bVar173;
  bVar142 = (bVar172 < bVar142) * bVar142 | (bVar172 >= bVar142) * bVar172;
  bVar143 = (bVar171 < bVar143) * bVar143 | (bVar171 >= bVar143) * bVar171;
  bVar145 = (bVar279 < bVar145) * bVar145 | (bVar279 >= bVar145) * bVar279;
  bVar146 = (bVar170 < bVar146) * bVar146 | (bVar170 >= bVar146) * bVar170;
  bVar149 = (bVar169 < bVar149) * bVar149 | (bVar169 >= bVar149) * bVar169;
  bVar150 = (bVar168 < bVar150) * bVar150 | (bVar168 >= bVar150) * bVar168;
  bVar153 = (bVar159 < bVar153) * bVar153 | (bVar159 >= bVar153) * bVar159;
  bVar173 = (bVar173 != 0) * bVar173;
  bVar172 = (bVar172 != 0) * bVar172;
  bVar171 = (bVar171 != 0) * bVar171;
  bVar279 = (bVar279 != 0) * bVar279;
  bVar170 = (bVar170 != 0) * bVar170;
  bVar169 = (bVar169 != 0) * bVar169;
  bVar168 = (bVar168 != 0) * bVar168;
  bVar159 = (bVar159 != 0) * bVar159;
  auVar213[0] = -((byte)((bVar138 == 0) * bVar138 | bVar138 != 0) == bVar138);
  auVar213[1] = -((byte)((bVar142 == 0) * bVar142 | bVar142 != 0) == bVar142);
  auVar213[2] = -((byte)((bVar143 == 0) * bVar143 | bVar143 != 0) == bVar143);
  auVar213[3] = -((byte)((bVar145 == 0) * bVar145 | bVar145 != 0) == bVar145);
  auVar213[4] = -((byte)((bVar146 == 0) * bVar146 | bVar146 != 0) == bVar146);
  auVar213[5] = -((byte)((bVar149 == 0) * bVar149 | bVar149 != 0) == bVar149);
  auVar213[6] = -((byte)((bVar150 == 0) * bVar150 | bVar150 != 0) == bVar150);
  auVar213[7] = -((byte)((bVar153 == 0) * bVar153 | bVar153 != 0) == bVar153);
  auVar213[8] = -((byte)((bVar173 == 0) * bVar173 | bVar173 != 0) == bVar173);
  auVar213[9] = -((byte)((bVar172 == 0) * bVar172 | bVar172 != 0) == bVar172);
  auVar213[10] = -((byte)((bVar171 == 0) * bVar171 | bVar171 != 0) == bVar171);
  auVar213[0xb] = -((byte)((bVar279 == 0) * bVar279 | bVar279 != 0) == bVar279);
  auVar213[0xc] = -((byte)((bVar170 == 0) * bVar170 | bVar170 != 0) == bVar170);
  auVar213[0xd] = -((byte)((bVar169 == 0) * bVar169 | bVar169 != 0) == bVar169);
  auVar213[0xe] = -((byte)((bVar168 == 0) * bVar168 | bVar168 != 0) == bVar168);
  auVar213[0xf] = -((byte)((bVar159 == 0) * bVar159 | bVar159 != 0) == bVar159);
  auVar213 = auVar213 & auVar103;
  if ((((((((((((((((auVar213 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar213 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar213 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar213 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar213 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar213 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar213 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar213 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar213 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar213 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar213 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar213 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar213 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar213 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar213 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar213[0xf] < '\0')
  {
    uVar210 = *(undefined8 *)(s + lVar98 * 6);
    uVar10 = *(undefined8 *)(s + -(long)(p * 7));
    auVar12[0xd] = 0;
    auVar12._0_13_ = local_168._0_13_;
    auVar12[0xe] = (char)((ulong)uVar4 >> 0x38);
    uVar158 = auVar12._13_2_;
    auVar18[0xc] = (char)((ulong)uVar4 >> 0x30);
    auVar18._0_12_ = local_168._0_12_;
    auVar18._13_2_ = uVar158;
    auVar25[0xb] = 0;
    auVar25._0_11_ = local_168._0_11_;
    auVar25._12_3_ = auVar18._12_3_;
    auVar32[10] = (char)((ulong)uVar4 >> 0x28);
    auVar32._0_10_ = local_168._0_10_;
    auVar32._11_4_ = auVar25._11_4_;
    auVar39[9] = 0;
    auVar39._0_9_ = local_168._0_9_;
    auVar39._10_5_ = auVar32._10_5_;
    auVar46[8] = (char)((ulong)uVar4 >> 0x20);
    auVar46._0_8_ = uVar4;
    auVar46._9_6_ = auVar39._9_6_;
    auVar64._7_8_ = 0;
    auVar64._0_7_ = auVar46._8_7_;
    Var65 = CONCAT81(SUB158(auVar64 << 0x40,7),(char)((ulong)uVar4 >> 0x18));
    auVar84._9_6_ = 0;
    auVar84._0_9_ = Var65;
    auVar66._1_10_ = SUB1510(auVar84 << 0x30,5);
    auVar66[0] = (char)((ulong)uVar4 >> 0x10);
    auVar85._11_4_ = 0;
    auVar85._0_11_ = auVar66;
    auVar54[2] = (char)((ulong)uVar4 >> 8);
    auVar54._0_2_ = (ushort)uVar4;
    auVar54._3_12_ = SUB1512(auVar85 << 0x20,3);
    uVar326 = (ushort)uVar4 & 0xff;
    auVar13[0xd] = 0;
    auVar13._0_13_ = auVar328._0_13_;
    auVar13[0xe] = (char)((ulong)uVar6 >> 0x38);
    auVar19[0xc] = (char)((ulong)uVar6 >> 0x30);
    auVar19._0_12_ = auVar328._0_12_;
    auVar19._13_2_ = auVar13._13_2_;
    auVar26[0xb] = 0;
    auVar26._0_11_ = auVar328._0_11_;
    auVar26._12_3_ = auVar19._12_3_;
    auVar33[10] = (char)((ulong)uVar6 >> 0x28);
    auVar33._0_10_ = auVar328._0_10_;
    auVar33._11_4_ = auVar26._11_4_;
    auVar40[9] = 0;
    auVar40._0_9_ = auVar328._0_9_;
    auVar40._10_5_ = auVar33._10_5_;
    auVar47[8] = (char)((ulong)uVar6 >> 0x20);
    auVar47._0_8_ = uVar6;
    auVar47._9_6_ = auVar40._9_6_;
    auVar67._7_8_ = 0;
    auVar67._0_7_ = auVar47._8_7_;
    Var68 = CONCAT81(SUB158(auVar67 << 0x40,7),(char)((ulong)uVar6 >> 0x18));
    auVar86._9_6_ = 0;
    auVar86._0_9_ = Var68;
    auVar69._1_10_ = SUB1510(auVar86 << 0x30,5);
    auVar69[0] = (char)((ulong)uVar6 >> 0x10);
    auVar87._11_4_ = 0;
    auVar87._0_11_ = auVar69;
    auVar55[2] = (char)((ulong)uVar6 >> 8);
    auVar55._0_2_ = (ushort)uVar6;
    auVar55._3_12_ = SUB1512(auVar87 << 0x20,3);
    uVar152 = (ushort)uVar6 & 0xff;
    auVar14[0xd] = 0;
    auVar14._0_13_ = auVar312._0_13_;
    auVar14[0xe] = (char)((ulong)uVar8 >> 0x38);
    uVar234 = auVar14._13_2_;
    auVar20[0xc] = (char)((ulong)uVar8 >> 0x30);
    auVar20._0_12_ = auVar312._0_12_;
    auVar20._13_2_ = uVar234;
    auVar27[0xb] = 0;
    auVar27._0_11_ = auVar312._0_11_;
    auVar27._12_3_ = auVar20._12_3_;
    auVar34[10] = (char)((ulong)uVar8 >> 0x28);
    auVar34._0_10_ = auVar312._0_10_;
    auVar34._11_4_ = auVar27._11_4_;
    auVar41[9] = 0;
    auVar41._0_9_ = auVar312._0_9_;
    auVar41._10_5_ = auVar34._10_5_;
    auVar48[8] = (char)((ulong)uVar8 >> 0x20);
    auVar48._0_8_ = uVar8;
    auVar48._9_6_ = auVar41._9_6_;
    auVar70._7_8_ = 0;
    auVar70._0_7_ = auVar48._8_7_;
    Var71 = CONCAT81(SUB158(auVar70 << 0x40,7),(char)((ulong)uVar8 >> 0x18));
    auVar88._9_6_ = 0;
    auVar88._0_9_ = Var71;
    auVar72._1_10_ = SUB1510(auVar88 << 0x30,5);
    auVar72[0] = (char)((ulong)uVar8 >> 0x10);
    auVar89._11_4_ = 0;
    auVar89._0_11_ = auVar72;
    auVar73._1_12_ = SUB1512(auVar89 << 0x20,3);
    auVar73[0] = (char)((ulong)uVar8 >> 8);
    uVar224 = (ushort)(byte)uVar8;
    auVar15[0xd] = 0;
    auVar15._0_13_ = auVar225._0_13_;
    auVar15[0xe] = (char)((ulong)uVar9 >> 0x38);
    uVar136 = auVar15._13_2_;
    auVar21[0xc] = (char)((ulong)uVar9 >> 0x30);
    auVar21._0_12_ = auVar225._0_12_;
    auVar21._13_2_ = uVar136;
    auVar28[0xb] = 0;
    auVar28._0_11_ = auVar225._0_11_;
    auVar28._12_3_ = auVar21._12_3_;
    auVar35[10] = (char)((ulong)uVar9 >> 0x28);
    auVar35._0_10_ = auVar225._0_10_;
    auVar35._11_4_ = auVar28._11_4_;
    auVar42[9] = 0;
    auVar42._0_9_ = auVar225._0_9_;
    auVar42._10_5_ = auVar35._10_5_;
    auVar49[8] = (char)((ulong)uVar9 >> 0x20);
    auVar49._0_8_ = uVar9;
    auVar49._9_6_ = auVar42._9_6_;
    auVar74._7_8_ = 0;
    auVar74._0_7_ = auVar49._8_7_;
    Var75 = CONCAT81(SUB158(auVar74 << 0x40,7),(char)((ulong)uVar9 >> 0x18));
    auVar90._9_6_ = 0;
    auVar90._0_9_ = Var75;
    auVar76._1_10_ = SUB1510(auVar90 << 0x30,5);
    auVar76[0] = (char)((ulong)uVar9 >> 0x10);
    auVar91._11_4_ = 0;
    auVar91._0_11_ = auVar76;
    auVar56[2] = (char)((ulong)uVar9 >> 8);
    auVar56._0_2_ = (ushort)uVar9;
    auVar56._3_12_ = SUB1512(auVar91 << 0x20,3);
    uVar134 = (ushort)uVar9 & 0xff;
    uVar122 = (ushort)(byte)uVar11;
    bVar138 = (byte)((ulong)uVar11 >> 8);
    bVar142 = (byte)((ulong)uVar11 >> 0x10);
    bVar143 = (byte)((ulong)uVar11 >> 0x18);
    bVar145 = (byte)((ulong)uVar11 >> 0x20);
    bVar146 = (byte)((ulong)uVar11 >> 0x28);
    bVar149 = (byte)((ulong)uVar11 >> 0x30);
    bVar150 = (byte)((ulong)uVar11 >> 0x38);
    uVar311 = (ushort)(byte)uVar7;
    bVar287 = (byte)((ulong)uVar7 >> 8);
    bVar314 = (byte)((ulong)uVar7 >> 0x10);
    bVar316 = (byte)((ulong)uVar7 >> 0x18);
    bVar318 = (byte)((ulong)uVar7 >> 0x20);
    bVar320 = (byte)((ulong)uVar7 >> 0x28);
    bVar322 = (byte)((ulong)uVar7 >> 0x30);
    bVar324 = (byte)((ulong)uVar7 >> 0x38);
    uVar207 = (ushort)(byte)uVar5;
    bVar270 = (byte)((ulong)uVar5 >> 8);
    bVar271 = (byte)((ulong)uVar5 >> 0x10);
    bVar274 = (byte)((ulong)uVar5 >> 0x18);
    bVar275 = (byte)((ulong)uVar5 >> 0x20);
    bVar278 = (byte)((ulong)uVar5 >> 0x28);
    bVar280 = (byte)((ulong)uVar5 >> 0x30);
    bVar283 = (byte)((ulong)uVar5 >> 0x38);
    uVar206 = (ushort)(byte)uVar3;
    bVar117 = (byte)((ulong)uVar3 >> 8);
    bVar174 = (byte)((ulong)uVar3 >> 0x10);
    bVar252 = (byte)((ulong)uVar3 >> 0x18);
    bVar262 = (byte)((ulong)uVar3 >> 0x20);
    bVar263 = (byte)((ulong)uVar3 >> 0x28);
    bVar266 = (byte)((ulong)uVar3 >> 0x30);
    bVar267 = (byte)((ulong)uVar3 >> 0x38);
    auVar99._0_8_ = auVar213._0_8_;
    auVar99._8_4_ = auVar213._0_4_;
    auVar99._12_4_ = auVar213._4_4_;
    sStack_116 = auVar55._2_2_;
    sStack_114 = auVar69._0_2_;
    sStack_112 = (short)Var68;
    sStack_110 = auVar47._8_2_;
    sStack_10e = auVar33._10_2_;
    sStack_10c = auVar19._12_2_;
    uVar148 = auVar13._13_2_ >> 8;
    sVar179 = auVar73._0_2_;
    sVar183 = auVar72._0_2_;
    sVar187 = (short)Var71;
    sVar191 = auVar48._8_2_;
    sVar195 = auVar34._10_2_;
    sVar199 = auVar20._12_2_;
    uVar119 = uVar234 >> 8;
    sVar291 = uVar224 + uVar152 + uVar134;
    sVar177 = auVar56._2_2_;
    sVar297 = sVar179 + sStack_116 + sVar177;
    sVar182 = auVar76._0_2_;
    sVar299 = sVar183 + sStack_114 + sVar182;
    sVar186 = (short)Var75;
    sVar301 = sVar187 + sStack_112 + sVar186;
    sVar190 = auVar49._8_2_;
    sVar303 = sVar191 + sStack_110 + sVar190;
    sVar194 = auVar35._10_2_;
    sVar305 = sVar195 + sStack_10e + sVar194;
    sVar198 = auVar21._12_2_;
    sVar307 = sVar199 + sStack_10c + sVar198;
    sVar309 = uVar119 + uVar148 + (uVar136 >> 8);
    uVar124 = (ushort)bVar287;
    uVar126 = (ushort)bVar270;
    uVar128 = (ushort)bVar271;
    uVar130 = (ushort)bVar274;
    uVar132 = (ushort)bVar275;
    uVar135 = (ushort)bVar278;
    uVar137 = (ushort)bVar280;
    uVar250 = (ushort)bVar283;
    sVar235 = uVar311 + uVar207 + uVar122;
    sVar238 = uVar124 + uVar126 + (ushort)bVar138;
    sVar240 = bVar314 + uVar128 + (ushort)bVar142;
    sVar242 = bVar316 + uVar130 + (ushort)bVar143;
    sVar244 = bVar318 + uVar132 + (ushort)bVar145;
    sVar246 = bVar320 + uVar135 + (ushort)bVar146;
    sVar248 = bVar322 + uVar137 + (ushort)bVar149;
    sVar251 = bVar324 + uVar250 + (ushort)bVar150;
    sVar175 = sVar291 + sVar235 + 4;
    sVar180 = sVar297 + sVar238 + 4;
    sVar184 = sVar299 + sVar240 + 4;
    sVar188 = sVar301 + sVar242 + 4;
    sVar192 = sVar303 + sVar244 + 4;
    sVar196 = sVar305 + sVar246 + 4;
    sVar200 = sVar307 + sVar248 + 4;
    sVar202 = sVar309 + sVar251 + 4;
    sVar329 = auVar54._2_2_;
    sVar330 = auVar66._0_2_;
    sVar331 = (short)Var65;
    sVar332 = auVar46._8_2_;
    sVar333 = auVar32._10_2_;
    sVar334 = auVar18._12_2_;
    uVar204 = uVar158 >> 8;
    uVar292 = (ushort)(uVar134 + uVar326 + sVar175) >> 3;
    uVar298 = (ushort)(sVar177 + sVar329 + sVar180) >> 3;
    uVar300 = (ushort)(sVar182 + sVar330 + sVar184) >> 3;
    uVar302 = (ushort)(sVar186 + sVar331 + sVar188) >> 3;
    uVar304 = (ushort)(sVar190 + sVar332 + sVar192) >> 3;
    uVar306 = (ushort)(sVar194 + sVar333 + sVar196) >> 3;
    uVar308 = (ushort)(sVar198 + sVar334 + sVar200) >> 3;
    uVar310 = (ushort)((uVar136 >> 8) + uVar204 + sVar202) >> 3;
    uVar120 = (ushort)bVar117;
    uVar139 = (ushort)(uVar122 + uVar206 + sVar175) >> 3;
    uVar144 = (ushort)(bVar138 + uVar120 + sVar180) >> 3;
    uVar147 = (ushort)((ushort)bVar142 + (ushort)bVar174 + sVar184) >> 3;
    uVar151 = (ushort)((ushort)bVar143 + (ushort)bVar252 + sVar188) >> 3;
    uVar154 = (ushort)((ushort)bVar145 + (ushort)bVar262 + sVar192) >> 3;
    uVar155 = (ushort)((ushort)bVar146 + (ushort)bVar263 + sVar196) >> 3;
    uVar156 = (ushort)((ushort)bVar149 + (ushort)bVar266 + sVar200) >> 3;
    uVar157 = (ushort)((ushort)bVar150 + (ushort)bVar267 + sVar202) >> 3;
    auVar294[1] = (uVar298 != 0) * (uVar298 < 0x100) * (char)uVar298 - (0xff < uVar298);
    auVar294[0] = (uVar292 != 0) * (uVar292 < 0x100) * (char)uVar292 - (0xff < uVar292);
    auVar294[2] = (uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 - (0xff < uVar300);
    auVar294[3] = (uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 - (0xff < uVar302);
    auVar294[4] = (uVar304 != 0) * (uVar304 < 0x100) * (char)uVar304 - (0xff < uVar304);
    auVar294[5] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
    auVar294[6] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
    auVar294[7] = (uVar310 != 0) * (uVar310 < 0x100) * (char)uVar310 - (0xff < uVar310);
    auVar294[8] = (uVar139 != 0) * (uVar139 < 0x100) * (char)uVar139 - (0xff < uVar139);
    auVar294[9] = (uVar144 != 0) * (uVar144 < 0x100) * (char)uVar144 - (0xff < uVar144);
    auVar294[10] = (uVar147 != 0) * (uVar147 < 0x100) * (char)uVar147 - (0xff < uVar147);
    auVar294[0xb] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
    auVar294[0xc] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
    auVar294[0xd] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar155 - (0xff < uVar155);
    auVar294[0xe] = (uVar156 != 0) * (uVar156 < 0x100) * (char)uVar156 - (0xff < uVar156);
    auVar294[0xf] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
    uVar292 = (ushort)(uVar326 * 2 + uVar224 + (sVar175 - uVar207)) >> 3;
    uVar298 = (ushort)(sVar329 * 2 + sVar179 + (sVar180 - uVar126)) >> 3;
    uVar300 = (ushort)(sVar330 * 2 + sVar183 + (sVar184 - uVar128)) >> 3;
    uVar302 = (ushort)(sVar331 * 2 + sVar187 + (sVar188 - uVar130)) >> 3;
    uVar304 = (ushort)(sVar332 * 2 + sVar191 + (sVar192 - uVar132)) >> 3;
    uVar306 = (ushort)(sVar333 * 2 + sVar195 + (sVar196 - uVar135)) >> 3;
    uVar308 = (ushort)(sVar334 * 2 + sVar199 + (sVar200 - uVar137)) >> 3;
    uVar310 = (ushort)(uVar204 * 2 + uVar119 + (sVar202 - uVar250)) >> 3;
    uVar139 = (ushort)(uVar206 * 2 + uVar311 + (sVar175 - uVar152)) >> 3;
    uVar144 = (ushort)(uVar120 * 2 + uVar124 + (sVar180 - sStack_116)) >> 3;
    uVar147 = (ushort)((ushort)bVar174 + (ushort)bVar174 + (ushort)bVar314 + (sVar184 - sStack_114))
              >> 3;
    uVar151 = (ushort)((ushort)bVar252 + (ushort)bVar252 + (ushort)bVar316 + (sVar188 - sStack_112))
              >> 3;
    uVar154 = (ushort)((ushort)bVar262 + (ushort)bVar262 + (ushort)bVar318 + (sVar192 - sStack_110))
              >> 3;
    uVar155 = (ushort)((ushort)bVar263 + (ushort)bVar263 + (ushort)bVar320 + (sVar196 - sStack_10e))
              >> 3;
    uVar156 = (ushort)((ushort)bVar266 + (ushort)bVar266 + (ushort)bVar322 + (sVar200 - sStack_10c))
              >> 3;
    uVar157 = (ushort)((ushort)bVar267 + (ushort)bVar267 + (ushort)bVar324 + (sVar202 - uVar148)) >>
              3;
    auVar259[1] = (uVar298 != 0) * (uVar298 < 0x100) * (char)uVar298 - (0xff < uVar298);
    auVar259[0] = (uVar292 != 0) * (uVar292 < 0x100) * (char)uVar292 - (0xff < uVar292);
    auVar259[2] = (uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 - (0xff < uVar300);
    auVar259[3] = (uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 - (0xff < uVar302);
    auVar259[4] = (uVar304 != 0) * (uVar304 < 0x100) * (char)uVar304 - (0xff < uVar304);
    auVar259[5] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
    auVar259[6] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
    auVar259[7] = (uVar310 != 0) * (uVar310 < 0x100) * (char)uVar310 - (0xff < uVar310);
    auVar259[8] = (uVar139 != 0) * (uVar139 < 0x100) * (char)uVar139 - (0xff < uVar139);
    auVar259[9] = (uVar144 != 0) * (uVar144 < 0x100) * (char)uVar144 - (0xff < uVar144);
    auVar259[10] = (uVar147 != 0) * (uVar147 < 0x100) * (char)uVar147 - (0xff < uVar147);
    auVar259[0xb] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
    auVar259[0xc] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
    auVar259[0xd] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar155 - (0xff < uVar155);
    auVar259[0xe] = (uVar156 != 0) * (uVar156 < 0x100) * (char)uVar156 - (0xff < uVar156);
    auVar259[0xf] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
    uVar157 = (ushort)(((uVar326 * 3 + uVar152) - uVar311) + (sVar175 - uVar207)) >> 3;
    uVar292 = (ushort)(((sVar329 * 3 + sStack_116) - uVar124) + (sVar180 - uVar126)) >> 3;
    uVar298 = (ushort)(((sVar330 * 3 + sStack_114) - (ushort)bVar314) + (sVar184 - uVar128)) >> 3;
    uVar300 = (ushort)(((sVar331 * 3 + sStack_112) - (ushort)bVar316) + (sVar188 - uVar130)) >> 3;
    uVar302 = (ushort)(((sVar332 * 3 + sStack_110) - (ushort)bVar318) + (sVar192 - uVar132)) >> 3;
    uVar304 = (ushort)(((sVar333 * 3 + sStack_10e) - (ushort)bVar320) + (sVar196 - uVar135)) >> 3;
    uVar306 = (ushort)(((sVar334 * 3 + sStack_10c) - (ushort)bVar322) + (sVar200 - uVar137)) >> 3;
    uVar308 = (ushort)(((uVar204 * 3 + uVar148) - (ushort)bVar324) + (sVar202 - uVar250)) >> 3;
    uVar204 = (ushort)(((uVar206 * 3 + uVar207) - uVar224) + (sVar175 - uVar152)) >> 3;
    uVar139 = (ushort)(((uVar120 * 3 + uVar126) - sVar179) + (sVar180 - sStack_116)) >> 3;
    uVar144 = (ushort)((((ushort)bVar174 * 3 + uVar128) - sVar183) + (sVar184 - sStack_114)) >> 3;
    uVar147 = (ushort)((((ushort)bVar252 * 3 + uVar130) - sVar187) + (sVar188 - sStack_112)) >> 3;
    uVar151 = (ushort)((((ushort)bVar262 * 3 + uVar132) - sVar191) + (sVar192 - sStack_110)) >> 3;
    uVar154 = (ushort)((((ushort)bVar263 * 3 + uVar135) - sVar195) + (sVar196 - sStack_10e)) >> 3;
    uVar155 = (ushort)((((ushort)bVar266 * 3 + uVar137) - sVar199) + (sVar200 - sStack_10c)) >> 3;
    uVar156 = (ushort)((((ushort)bVar267 * 3 + uVar250) - uVar119) + (sVar202 - uVar148)) >> 3;
    auVar327[1] = (uVar292 != 0) * (uVar292 < 0x100) * (char)uVar292 - (0xff < uVar292);
    auVar327[0] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
    auVar327[2] = (uVar298 != 0) * (uVar298 < 0x100) * (char)uVar298 - (0xff < uVar298);
    auVar327[3] = (uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 - (0xff < uVar300);
    auVar327[4] = (uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 - (0xff < uVar302);
    auVar327[5] = (uVar304 != 0) * (uVar304 < 0x100) * (char)uVar304 - (0xff < uVar304);
    auVar327[6] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
    auVar327[7] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
    auVar327[8] = (uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204);
    auVar327[9] = (uVar139 != 0) * (uVar139 < 0x100) * (char)uVar139 - (0xff < uVar139);
    auVar327[10] = (uVar144 != 0) * (uVar144 < 0x100) * (char)uVar144 - (0xff < uVar144);
    auVar327[0xb] = (uVar147 != 0) * (uVar147 < 0x100) * (char)uVar147 - (0xff < uVar147);
    auVar327[0xc] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
    auVar327[0xd] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
    auVar327[0xe] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar155 - (0xff < uVar155);
    auVar327[0xf] = (uVar156 != 0) * (uVar156 < 0x100) * (char)uVar156 - (0xff < uVar156);
    auVar103 = psubusb(auVar141,auVar225);
    auVar178 = psubusb(auVar225,auVar141);
    auVar178 = auVar178 | auVar103;
    auVar103 = psubusb(local_178,auVar225);
    auVar258 = psubusb(auVar225,local_178);
    auVar258 = auVar258 | auVar103;
    bVar279 = auVar178[0];
    bVar159 = auVar258[0];
    bVar159 = (bVar159 < bVar279) * bVar279 | (bVar159 >= bVar279) * bVar159;
    bVar279 = auVar178[1];
    bVar168 = auVar258[1];
    bVar168 = (bVar168 < bVar279) * bVar279 | (bVar168 >= bVar279) * bVar168;
    bVar279 = auVar178[2];
    bVar169 = auVar258[2];
    bVar169 = (bVar169 < bVar279) * bVar279 | (bVar169 >= bVar279) * bVar169;
    bVar279 = auVar178[3];
    bVar170 = auVar258[3];
    bVar170 = (bVar170 < bVar279) * bVar279 | (bVar170 >= bVar279) * bVar170;
    bVar279 = auVar178[4];
    bVar171 = auVar258[4];
    bVar171 = (bVar171 < bVar279) * bVar279 | (bVar171 >= bVar279) * bVar171;
    bVar279 = auVar178[5];
    bVar172 = auVar258[5];
    bVar172 = (bVar172 < bVar279) * bVar279 | (bVar172 >= bVar279) * bVar172;
    bVar279 = auVar178[6];
    bVar173 = auVar258[6];
    bVar173 = (bVar173 < bVar279) * bVar279 | (bVar173 >= bVar279) * bVar173;
    bVar279 = auVar178[7];
    bVar153 = auVar258[7];
    bVar115 = (bVar153 < bVar279) * bVar279 | (bVar153 >= bVar279) * bVar153;
    bVar279 = auVar178[8];
    bVar153 = auVar258[8];
    bVar284 = (bVar153 < bVar279) * bVar279 | (bVar153 >= bVar279) * bVar153;
    bVar279 = auVar178[9];
    bVar153 = auVar258[9];
    bVar288 = (bVar153 < bVar279) * bVar279 | (bVar153 >= bVar279) * bVar153;
    bVar279 = auVar178[10];
    bVar153 = auVar258[10];
    bVar315 = (bVar153 < bVar279) * bVar279 | (bVar153 >= bVar279) * bVar153;
    bVar279 = auVar178[0xb];
    bVar153 = auVar258[0xb];
    bVar317 = (bVar153 < bVar279) * bVar279 | (bVar153 >= bVar279) * bVar153;
    bVar279 = auVar178[0xc];
    bVar153 = auVar258[0xc];
    bVar319 = (bVar153 < bVar279) * bVar279 | (bVar153 >= bVar279) * bVar153;
    bVar279 = auVar178[0xd];
    bVar153 = auVar258[0xd];
    bVar321 = (bVar153 < bVar279) * bVar279 | (bVar153 >= bVar279) * bVar153;
    bVar279 = auVar178[0xe];
    bVar153 = auVar258[0xe];
    bVar101 = auVar258[0xf];
    bVar323 = (bVar153 < bVar279) * bVar279 | (bVar153 >= bVar279) * bVar153;
    bVar279 = auVar178[0xf];
    bVar325 = (bVar101 < bVar279) * bVar279 | (bVar101 >= bVar279) * bVar101;
    auVar63._8_8_ = uVar210;
    auVar63._0_8_ = uVar10;
    auVar103 = psubusb(auVar63,auVar225);
    auVar178 = psubusb(auVar225,auVar63);
    auVar178 = auVar178 | auVar103;
    bVar279 = auVar178[0];
    bVar153 = (bVar279 < bVar159) * bVar159 | (bVar279 >= bVar159) * bVar279;
    bVar279 = auVar178[1];
    bVar101 = (bVar279 < bVar168) * bVar168 | (bVar279 >= bVar168) * bVar279;
    bVar279 = auVar178[2];
    bVar105 = (bVar279 < bVar169) * bVar169 | (bVar279 >= bVar169) * bVar279;
    bVar279 = auVar178[3];
    bVar107 = (bVar279 < bVar170) * bVar170 | (bVar279 >= bVar170) * bVar279;
    bVar279 = auVar178[4];
    bVar109 = (bVar279 < bVar171) * bVar171 | (bVar279 >= bVar171) * bVar279;
    bVar279 = auVar178[5];
    bVar111 = (bVar279 < bVar172) * bVar172 | (bVar279 >= bVar172) * bVar279;
    bVar279 = auVar178[6];
    bVar113 = (bVar279 < bVar173) * bVar173 | (bVar279 >= bVar173) * bVar279;
    bVar279 = auVar178[7];
    bVar115 = (bVar279 < bVar115) * bVar115 | (bVar279 >= bVar115) * bVar279;
    bVar279 = auVar178[8];
    bVar173 = (bVar279 < bVar284) * bVar284 | (bVar279 >= bVar284) * bVar279;
    bVar279 = auVar178[9];
    bVar279 = (bVar279 < bVar288) * bVar288 | (bVar279 >= bVar288) * bVar279;
    bVar159 = auVar178[10];
    bVar159 = (bVar159 < bVar315) * bVar315 | (bVar159 >= bVar315) * bVar159;
    bVar168 = auVar178[0xb];
    bVar168 = (bVar168 < bVar317) * bVar317 | (bVar168 >= bVar317) * bVar168;
    bVar169 = auVar178[0xc];
    bVar169 = (bVar169 < bVar319) * bVar319 | (bVar169 >= bVar319) * bVar169;
    bVar170 = auVar178[0xd];
    bVar170 = (bVar170 < bVar321) * bVar321 | (bVar170 >= bVar321) * bVar170;
    bVar171 = auVar178[0xe];
    bVar172 = auVar178[0xf];
    bVar171 = (bVar171 < bVar323) * bVar323 | (bVar171 >= bVar323) * bVar171;
    bVar172 = (bVar172 < bVar325) * bVar325 | (bVar172 >= bVar325) * bVar172;
    bVar153 = (bVar173 < bVar153) * bVar153 | (bVar173 >= bVar153) * bVar173;
    bVar101 = (bVar279 < bVar101) * bVar101 | (bVar279 >= bVar101) * bVar279;
    bVar105 = (bVar159 < bVar105) * bVar105 | (bVar159 >= bVar105) * bVar159;
    bVar107 = (bVar168 < bVar107) * bVar107 | (bVar168 >= bVar107) * bVar168;
    bVar109 = (bVar169 < bVar109) * bVar109 | (bVar169 >= bVar109) * bVar169;
    bVar111 = (bVar170 < bVar111) * bVar111 | (bVar170 >= bVar111) * bVar170;
    bVar113 = (bVar171 < bVar113) * bVar113 | (bVar171 >= bVar113) * bVar171;
    bVar115 = (bVar172 < bVar115) * bVar115 | (bVar172 >= bVar115) * bVar172;
    bVar173 = (bVar173 != 0) * bVar173;
    bVar279 = (bVar279 != 0) * bVar279;
    bVar159 = (bVar159 != 0) * bVar159;
    bVar168 = (bVar168 != 0) * bVar168;
    bVar169 = (bVar169 != 0) * bVar169;
    bVar170 = (bVar170 != 0) * bVar170;
    bVar171 = (bVar171 != 0) * bVar171;
    bVar172 = (bVar172 != 0) * bVar172;
    auVar226[0] = -((byte)((bVar153 == 0) * bVar153 | bVar153 != 0) == bVar153);
    auVar226[1] = -((byte)((bVar101 == 0) * bVar101 | bVar101 != 0) == bVar101);
    auVar226[2] = -((byte)((bVar105 == 0) * bVar105 | bVar105 != 0) == bVar105);
    auVar226[3] = -((byte)((bVar107 == 0) * bVar107 | bVar107 != 0) == bVar107);
    auVar226[4] = -((byte)((bVar109 == 0) * bVar109 | bVar109 != 0) == bVar109);
    auVar226[5] = -((byte)((bVar111 == 0) * bVar111 | bVar111 != 0) == bVar111);
    auVar226[6] = -((byte)((bVar113 == 0) * bVar113 | bVar113 != 0) == bVar113);
    auVar226[7] = -((byte)((bVar115 == 0) * bVar115 | bVar115 != 0) == bVar115);
    auVar226[8] = -((byte)((bVar173 == 0) * bVar173 | bVar173 != 0) == bVar173);
    auVar226[9] = -((byte)((bVar279 == 0) * bVar279 | bVar279 != 0) == bVar279);
    auVar226[10] = -((byte)((bVar159 == 0) * bVar159 | bVar159 != 0) == bVar159);
    auVar226[0xb] = -((byte)((bVar168 == 0) * bVar168 | bVar168 != 0) == bVar168);
    auVar226[0xc] = -((byte)((bVar169 == 0) * bVar169 | bVar169 != 0) == bVar169);
    auVar226[0xd] = -((byte)((bVar170 == 0) * bVar170 | bVar170 != 0) == bVar170);
    auVar226[0xe] = -((byte)((bVar171 == 0) * bVar171 | bVar171 != 0) == bVar171);
    auVar226[0xf] = -((byte)((bVar172 == 0) * bVar172 | bVar172 != 0) == bVar172);
    auVar226 = auVar226 & auVar213;
    auVar328 = auVar327 & auVar99 | ~auVar99 & auVar328;
    auVar260 = auVar259 & auVar99 | ~auVar99 & auVar260;
    auVar295 = auVar294 & auVar99 | ~auVar99 & auVar295;
    if ((((((((((((((((auVar226 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar226 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar226 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar226 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar226 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar226 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar226 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar226 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar226 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar226 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar226 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar226 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar226 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar226 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar226 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar226[0xf] < '\0'
       ) {
      auVar100._0_8_ = auVar226._0_8_;
      auVar100._8_4_ = auVar226._0_4_;
      auVar100._12_4_ = auVar226._4_4_;
      auVar22[0xd] = 0;
      auVar22._0_13_ = auVar141._0_13_;
      auVar22[0xe] = (char)((ulong)uVar2 >> 0x38);
      auVar29[0xc] = (char)((ulong)uVar2 >> 0x30);
      auVar29._0_12_ = auVar141._0_12_;
      auVar29._13_2_ = auVar22._13_2_;
      auVar36[0xb] = 0;
      auVar36._0_11_ = auVar141._0_11_;
      auVar36._12_3_ = auVar29._12_3_;
      auVar43[10] = (char)((ulong)uVar2 >> 0x28);
      auVar43._0_10_ = auVar141._0_10_;
      auVar43._11_4_ = auVar36._11_4_;
      auVar50[9] = 0;
      auVar50._0_9_ = auVar141._0_9_;
      auVar50._10_5_ = auVar43._10_5_;
      auVar53[8] = (char)((ulong)uVar2 >> 0x20);
      auVar53._0_8_ = uVar2;
      auVar53._9_6_ = auVar50._9_6_;
      auVar77._7_8_ = 0;
      auVar77._0_7_ = auVar53._8_7_;
      Var65 = CONCAT81(SUB158(auVar77 << 0x40,7),(char)((ulong)uVar2 >> 0x18));
      auVar92._9_6_ = 0;
      auVar92._0_9_ = Var65;
      auVar78._1_10_ = SUB1510(auVar92 << 0x30,5);
      auVar78[0] = (char)((ulong)uVar2 >> 0x10);
      auVar93._11_4_ = 0;
      auVar93._0_11_ = auVar78;
      auVar79._1_12_ = SUB1512(auVar93 << 0x20,3);
      auVar79[0] = (char)((ulong)uVar2 >> 8);
      uVar120 = (ushort)(byte)uVar2;
      uVar223 = (ushort)(byte)uVar1;
      bVar113 = (byte)((ulong)uVar1 >> 0x10);
      bVar115 = (byte)((ulong)uVar1 >> 0x18);
      bVar284 = (byte)((ulong)uVar1 >> 0x20);
      bVar288 = (byte)((ulong)uVar1 >> 0x28);
      bVar315 = (byte)((ulong)uVar1 >> 0x30);
      bVar317 = (byte)((ulong)uVar1 >> 0x38);
      sVar123 = auVar79._0_2_;
      uVar227 = (ushort)(byte)((ulong)uVar1 >> 8);
      sVar125 = auVar78._0_2_;
      uVar228 = (ushort)bVar113;
      sVar127 = (short)Var65;
      uVar229 = (ushort)bVar115;
      sVar129 = auVar53._8_2_;
      uVar230 = (ushort)bVar284;
      sVar131 = auVar43._10_2_;
      uVar231 = (ushort)bVar288;
      sVar133 = auVar29._12_2_;
      uVar139 = auVar22._13_2_ >> 8;
      uVar232 = (ushort)bVar315;
      uVar233 = (ushort)bVar317;
      uVar158 = uVar158 >> 8;
      uStack_c6 = (ushort)bVar117;
      uStack_c4 = (ushort)bVar174;
      uStack_c2 = (ushort)bVar252;
      uStack_c0 = (ushort)bVar262;
      uStack_be = (ushort)bVar263;
      uStack_bc = (ushort)bVar266;
      uStack_ba = (ushort)bVar267;
      auVar16[0xd] = 0;
      auVar16._0_13_ = auVar63._0_13_;
      auVar16[0xe] = (char)((ulong)uVar10 >> 0x38);
      auVar23[0xc] = (char)((ulong)uVar10 >> 0x30);
      auVar23._0_12_ = auVar63._0_12_;
      auVar23._13_2_ = auVar16._13_2_;
      auVar30[0xb] = 0;
      auVar30._0_11_ = auVar63._0_11_;
      auVar30._12_3_ = auVar23._12_3_;
      auVar37[10] = (char)((ulong)uVar10 >> 0x28);
      auVar37._0_10_ = auVar63._0_10_;
      auVar37._11_4_ = auVar30._11_4_;
      auVar44[9] = 0;
      auVar44._0_9_ = auVar63._0_9_;
      auVar44._10_5_ = auVar37._10_5_;
      auVar51[8] = (char)((ulong)uVar10 >> 0x20);
      auVar51._0_8_ = uVar10;
      auVar51._9_6_ = auVar44._9_6_;
      auVar80._7_8_ = 0;
      auVar80._0_7_ = auVar51._8_7_;
      Var65 = CONCAT81(SUB158(auVar80 << 0x40,7),(char)((ulong)uVar10 >> 0x18));
      auVar94._9_6_ = 0;
      auVar94._0_9_ = Var65;
      auVar81._1_10_ = SUB1510(auVar94 << 0x30,5);
      auVar81[0] = (char)((ulong)uVar10 >> 0x10);
      auVar95._11_4_ = 0;
      auVar95._0_11_ = auVar81;
      auVar57[2] = (char)((ulong)uVar10 >> 8);
      auVar57._0_2_ = (ushort)uVar10;
      auVar57._3_12_ = SUB1512(auVar95 << 0x20,3);
      auVar313._0_2_ = (ushort)uVar10 & 0xff;
      auVar313._2_13_ = auVar57._2_13_;
      auVar313[0xf] = 0;
      sVar264 = auVar57._2_2_;
      sVar268 = auVar81._0_2_;
      sVar272 = (short)Var65;
      sVar276 = auVar51._8_2_;
      sVar281 = auVar37._10_2_;
      sVar285 = auVar23._12_2_;
      uVar144 = auVar16._13_2_ >> 8;
      auVar17[0xd] = 0;
      auVar17._0_13_ = local_178._0_13_;
      auVar17[0xe] = (char)((ulong)local_178._0_8_ >> 0x38);
      uVar204 = auVar17._13_2_;
      auVar24[0xc] = (char)((ulong)local_178._0_8_ >> 0x30);
      auVar24._0_12_ = local_178._0_12_;
      auVar24._13_2_ = uVar204;
      auVar31[0xb] = 0;
      auVar31._0_11_ = local_178._0_11_;
      auVar31._12_3_ = auVar24._12_3_;
      auVar38[10] = (char)((ulong)local_178._0_8_ >> 0x28);
      auVar38._0_10_ = local_178._0_10_;
      auVar38._11_4_ = auVar31._11_4_;
      auVar45[9] = 0;
      auVar45._0_9_ = local_178._0_9_;
      auVar45._10_5_ = auVar38._10_5_;
      auVar52[8] = (char)((ulong)local_178._0_8_ >> 0x20);
      auVar52._0_8_ = local_178._0_8_;
      auVar52._9_6_ = auVar45._9_6_;
      auVar82._7_8_ = 0;
      auVar82._0_7_ = auVar52._8_7_;
      Var65 = CONCAT81(SUB158(auVar82 << 0x40,7),(char)((ulong)local_178._0_8_ >> 0x18));
      auVar96._9_6_ = 0;
      auVar96._0_9_ = Var65;
      auVar83._1_10_ = SUB1510(auVar96 << 0x30,5);
      auVar83[0] = (char)((ulong)local_178._0_8_ >> 0x10);
      auVar97._11_4_ = 0;
      auVar97._0_11_ = auVar83;
      auVar58[2] = (char)((ulong)local_178._0_8_ >> 8);
      auVar58._0_2_ = (ushort)local_178._0_8_;
      auVar58._3_12_ = SUB1512(auVar97 << 0x20,3);
      uVar236 = (ushort)local_178._0_8_ & 0xff;
      uVar147 = (ushort)(byte)local_178._8_8_;
      bVar279 = (byte)((ulong)local_178._8_8_ >> 8);
      bVar159 = (byte)((ulong)local_178._8_8_ >> 0x10);
      bVar168 = (byte)((ulong)local_178._8_8_ >> 0x18);
      bVar169 = (byte)((ulong)local_178._8_8_ >> 0x20);
      bVar170 = (byte)((ulong)local_178._8_8_ >> 0x28);
      bVar171 = (byte)((ulong)local_178._8_8_ >> 0x30);
      bVar172 = (byte)((ulong)local_178._8_8_ >> 0x38);
      auVar208._0_2_ = CONCAT11(0,(byte)uVar210);
      bVar173 = (byte)((ulong)uVar210 >> 8);
      auVar208[2] = bVar173;
      auVar208[3] = 0;
      bVar153 = (byte)((ulong)uVar210 >> 0x10);
      auVar208[4] = bVar153;
      auVar208[5] = 0;
      bVar101 = (byte)((ulong)uVar210 >> 0x18);
      auVar208[6] = bVar101;
      auVar208[7] = 0;
      bVar105 = (byte)((ulong)uVar210 >> 0x20);
      auVar208[8] = bVar105;
      auVar208[9] = 0;
      bVar107 = (byte)((ulong)uVar210 >> 0x28);
      auVar208[10] = bVar107;
      auVar208[0xb] = 0;
      bVar109 = (byte)((ulong)uVar210 >> 0x30);
      auVar208[0xc] = bVar109;
      auVar208[0xd] = 0;
      bVar111 = (byte)((ulong)uVar210 >> 0x38);
      auVar208[0xe] = bVar111;
      auVar208[0xf] = 0;
      sVar175 = uVar326 + uVar206 + uVar120 + uVar223 + sVar291 + sVar235 + 8;
      sVar180 = sVar329 + uStack_c6 + sVar123 + uVar227 + sVar297 + sVar238 + 8;
      sVar184 = sVar330 + uStack_c4 + sVar125 + uVar228 + sVar299 + sVar240 + 8;
      sVar188 = sVar331 + uStack_c2 + sVar127 + uVar229 + sVar301 + sVar242 + 8;
      sVar192 = sVar332 + uStack_c0 + sVar129 + uVar230 + sVar303 + sVar244 + 8;
      sVar196 = sVar333 + uStack_be + sVar131 + uVar231 + sVar305 + sVar246 + 8;
      sVar200 = sVar334 + uStack_bc + sVar133 + uVar232 + sVar307 + sVar248 + 8;
      sVar202 = uVar158 + uStack_ba + uVar139 + uVar233 + sVar309 + sVar251 + 8;
      uVar292 = (ushort)bVar173;
      uVar298 = (ushort)bVar153;
      uVar300 = (ushort)bVar101;
      uVar302 = (ushort)bVar105;
      uVar304 = (ushort)bVar107;
      uVar306 = (ushort)bVar109;
      uVar308 = (ushort)bVar111;
      sVar176 = sVar175 + uVar236;
      sVar239 = auVar58._2_2_;
      sVar181 = sVar180 + sVar239;
      sVar241 = auVar83._0_2_;
      sVar185 = sVar184 + sVar241;
      sVar243 = (short)Var65;
      sVar189 = sVar188 + sVar243;
      sVar245 = auVar52._8_2_;
      sVar193 = sVar192 + sVar245;
      sVar247 = auVar38._10_2_;
      sVar197 = sVar196 + sVar247;
      sVar249 = auVar24._12_2_;
      sVar201 = sVar200 + sVar249;
      sVar203 = sVar202 + (uVar204 >> 8);
      uVar253 = (ushort)(auVar313._0_2_ * 2 + sVar291 + sVar176) >> 4;
      uVar265 = (ushort)(sVar264 * 2 + sVar297 + sVar181) >> 4;
      uVar269 = (ushort)(sVar268 * 2 + sVar299 + sVar185) >> 4;
      uVar273 = (ushort)(sVar272 * 2 + sVar301 + sVar189) >> 4;
      uVar277 = (ushort)(sVar276 * 2 + sVar303 + sVar193) >> 4;
      uVar282 = (ushort)(sVar281 * 2 + sVar305 + sVar197) >> 4;
      uVar286 = (ushort)(sVar285 * 2 + sVar307 + sVar201) >> 4;
      uVar289 = (ushort)(uVar144 * 2 + sVar309 + sVar203) >> 4;
      sVar175 = sVar175 + uVar147;
      sVar180 = sVar180 + (ushort)bVar279;
      sVar184 = sVar184 + (ushort)bVar159;
      sVar188 = sVar188 + (ushort)bVar168;
      sVar192 = sVar192 + (ushort)bVar169;
      sVar196 = sVar196 + (ushort)bVar170;
      sVar200 = sVar200 + (ushort)bVar171;
      sVar202 = sVar202 + (ushort)bVar172;
      uVar151 = (ushort)(auVar208._0_2_ * 2 + sVar235 + sVar175) >> 4;
      uVar154 = (ushort)(uVar292 * 2 + sVar238 + sVar180) >> 4;
      uVar155 = (ushort)(bVar153 + uVar298 + sVar240 + sVar184) >> 4;
      uVar156 = (ushort)(bVar101 + uVar300 + sVar242 + sVar188) >> 4;
      uVar157 = (ushort)(bVar105 + uVar302 + sVar244 + sVar192) >> 4;
      uVar310 = (ushort)(bVar107 + uVar304 + sVar246 + sVar196) >> 4;
      uVar221 = (ushort)(bVar109 + uVar306 + sVar248 + sVar200) >> 4;
      uVar222 = (ushort)(bVar111 + uVar308 + sVar251 + sVar202) >> 4;
      auVar261[1] = (uVar265 != 0) * (uVar265 < 0x100) * (char)uVar265 - (0xff < uVar265);
      auVar261[0] = (uVar253 != 0) * (uVar253 < 0x100) * (char)uVar253 - (0xff < uVar253);
      auVar261[2] = (uVar269 != 0) * (uVar269 < 0x100) * (char)uVar269 - (0xff < uVar269);
      auVar261[3] = (uVar273 != 0) * (uVar273 < 0x100) * (char)uVar273 - (0xff < uVar273);
      auVar261[4] = (uVar277 != 0) * (uVar277 < 0x100) * (char)uVar277 - (0xff < uVar277);
      auVar261[5] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
      auVar261[6] = (uVar286 != 0) * (uVar286 < 0x100) * (char)uVar286 - (0xff < uVar286);
      auVar261[7] = (uVar289 != 0) * (uVar289 < 0x100) * (char)uVar289 - (0xff < uVar289);
      auVar261[8] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
      auVar261[9] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
      auVar261[10] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar155 - (0xff < uVar155);
      auVar261[0xb] = (uVar156 != 0) * (uVar156 < 0x100) * (char)uVar156 - (0xff < uVar156);
      auVar261[0xc] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
      auVar261[0xd] = (uVar310 != 0) * (uVar310 < 0x100) * (char)uVar310 - (0xff < uVar310);
      auVar261[0xe] = (uVar221 != 0) * (uVar221 < 0x100) * (char)uVar221 - (0xff < uVar221);
      auVar261[0xf] = (uVar222 != 0) * (uVar222 < 0x100) * (char)uVar222 - (0xff < uVar222);
      uStack_66 = (ushort)bVar138;
      uStack_64 = (ushort)bVar142;
      uStack_62 = (ushort)bVar143;
      uStack_60 = (ushort)bVar145;
      uStack_5e = (ushort)bVar146;
      uStack_5c = (ushort)bVar149;
      uStack_5a = (ushort)bVar150;
      uStack_126 = (ushort)bVar287;
      uStack_124 = (ushort)bVar314;
      uStack_122 = (ushort)bVar316;
      uStack_120 = (ushort)bVar318;
      uStack_11e = (ushort)bVar320;
      uStack_11c = (ushort)bVar322;
      uStack_11a = (ushort)bVar324;
      sVar235 = sVar181 + (ushort)bVar279;
      sVar238 = sVar185 + (ushort)bVar159;
      sVar240 = sVar189 + (ushort)bVar168;
      sVar242 = sVar193 + (ushort)bVar169;
      sVar244 = sVar197 + (ushort)bVar170;
      sVar246 = sVar201 + (ushort)bVar171;
      sVar248 = sVar203 + (ushort)bVar172;
      uVar310 = (ushort)(uVar134 + uVar224 + uVar122 + auVar313._0_2_ + sVar176 + uVar147) >> 4;
      uVar221 = (ushort)(sVar177 + sVar179 + uStack_66 + sVar264 + sVar235) >> 4;
      uVar222 = (ushort)(sVar182 + sVar183 + uStack_64 + sVar268 + sVar238) >> 4;
      uVar253 = (ushort)(sVar186 + sVar187 + uStack_62 + sVar272 + sVar240) >> 4;
      uVar265 = (ushort)(sVar190 + sVar191 + uStack_60 + sVar276 + sVar242) >> 4;
      uVar269 = (ushort)(sVar194 + sVar195 + uStack_5e + sVar281 + sVar244) >> 4;
      uVar273 = (ushort)(sVar198 + sVar199 + uStack_5c + sVar285 + sVar246) >> 4;
      uVar277 = (ushort)((uVar136 >> 8) + (uVar234 >> 8) + uStack_5a + uVar144 + sVar248) >> 4;
      uVar122 = (ushort)(uVar122 + uVar311 + uVar134 + auVar208._0_2_ + sVar176 + uVar147) >> 4;
      uVar151 = (ushort)(uStack_66 + uStack_126 + sVar177 + uVar292 + sVar235) >> 4;
      uVar154 = (ushort)(uStack_64 + uStack_124 + sVar182 + uVar298 + sVar238) >> 4;
      uVar155 = (ushort)(uStack_62 + uStack_122 + sVar186 + uVar300 + sVar240) >> 4;
      uVar156 = (ushort)(uStack_60 + uStack_120 + sVar190 + uVar302 + sVar242) >> 4;
      uVar157 = (ushort)(uStack_5e + uStack_11e + sVar194 + uVar304 + sVar244) >> 4;
      uVar134 = (ushort)(uStack_5c + uStack_11c + sVar198 + uVar306 + sVar246) >> 4;
      uVar136 = (ushort)(uStack_5a + uStack_11a + (uVar136 >> 8) + uVar308 + sVar248) >> 4;
      auVar296[1] = (uVar221 != 0) * (uVar221 < 0x100) * (char)uVar221 - (0xff < uVar221);
      auVar296[0] = (uVar310 != 0) * (uVar310 < 0x100) * (char)uVar310 - (0xff < uVar310);
      auVar296[2] = (uVar222 != 0) * (uVar222 < 0x100) * (char)uVar222 - (0xff < uVar222);
      auVar296[3] = (uVar253 != 0) * (uVar253 < 0x100) * (char)uVar253 - (0xff < uVar253);
      auVar296[4] = (uVar265 != 0) * (uVar265 < 0x100) * (char)uVar265 - (0xff < uVar265);
      auVar296[5] = (uVar269 != 0) * (uVar269 < 0x100) * (char)uVar269 - (0xff < uVar269);
      auVar296[6] = (uVar273 != 0) * (uVar273 < 0x100) * (char)uVar273 - (0xff < uVar273);
      auVar296[7] = (uVar277 != 0) * (uVar277 < 0x100) * (char)uVar277 - (0xff < uVar277);
      auVar296[8] = (uVar122 != 0) * (uVar122 < 0x100) * (char)uVar122 - (0xff < uVar122);
      auVar296[9] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
      auVar296[10] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
      auVar296[0xb] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar155 - (0xff < uVar155);
      auVar296[0xc] = (uVar156 != 0) * (uVar156 < 0x100) * (char)uVar156 - (0xff < uVar156);
      auVar296[0xd] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
      auVar296[0xe] = (uVar134 != 0) * (uVar134 < 0x100) * (char)uVar134 - (0xff < uVar134);
      auVar296[0xf] = (uVar136 != 0) * (uVar136 < 0x100) * (char)uVar136 - (0xff < uVar136);
      sVar175 = sVar175 - uVar120;
      sVar180 = sVar180 - sVar123;
      sVar184 = sVar184 - sVar125;
      sVar188 = sVar188 - sVar127;
      sVar192 = sVar192 - sVar129;
      sVar196 = sVar196 - sVar131;
      sVar200 = sVar200 - sVar133;
      sVar202 = sVar202 - uVar139;
      uVar136 = (ushort)(uVar224 + uVar152 + uVar326 + auVar313._0_2_ * 3 + (sVar176 - uVar223)) >>
                4;
      uVar122 = (ushort)(sVar179 + sStack_116 + sVar329 + sVar264 * 3 + (sVar181 - uVar227)) >> 4;
      uVar151 = (ushort)(sVar183 + sStack_114 + sVar330 + sVar268 * 3 + (sVar185 - uVar228)) >> 4;
      uVar154 = (ushort)(sVar187 + sStack_112 + sVar331 + sVar272 * 3 + (sVar189 - uVar229)) >> 4;
      uVar155 = (ushort)(sVar191 + sStack_110 + sVar332 + sVar276 * 3 + (sVar193 - uVar230)) >> 4;
      uVar156 = (ushort)(sVar195 + sStack_10e + sVar333 + sVar281 * 3 + (sVar197 - uVar231)) >> 4;
      uVar157 = (ushort)(sVar199 + sStack_10c + sVar334 + sVar285 * 3 + (sVar201 - uVar232)) >> 4;
      uVar119 = (ushort)(uVar119 + uVar148 + uVar158 + uVar144 * 3 + (sVar203 - uVar233)) >> 4;
      uVar134 = (ushort)(uVar311 + uVar207 + uVar206 + auVar208._0_2_ * 3 + sVar175) >> 4;
      uVar124 = (ushort)(uVar124 + uVar126 + uStack_c6 + uVar292 * 3 + sVar180) >> 4;
      uVar126 = (ushort)(bVar314 + uVar128 + uStack_c4 + uVar298 * 3 + sVar184) >> 4;
      uVar128 = (ushort)(bVar316 + uVar130 + uStack_c2 + uVar300 * 3 + sVar188) >> 4;
      uVar130 = (ushort)(bVar318 + uVar132 + uStack_c0 + uVar302 * 3 + sVar192) >> 4;
      uVar132 = (ushort)(bVar320 + uVar135 + uStack_be + uVar304 * 3 + sVar196) >> 4;
      uVar135 = (ushort)(bVar322 + uVar137 + uStack_bc + uVar306 * 3 + sVar200) >> 4;
      uVar137 = (ushort)(bVar324 + uVar250 + uStack_ba + uVar308 * 3 + sVar202) >> 4;
      auVar104[1] = (uVar122 != 0) * (uVar122 < 0x100) * (char)uVar122 - (0xff < uVar122);
      auVar104[0] = (uVar136 != 0) * (uVar136 < 0x100) * (char)uVar136 - (0xff < uVar136);
      auVar104[2] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
      auVar104[3] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
      auVar104[4] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar155 - (0xff < uVar155);
      auVar104[5] = (uVar156 != 0) * (uVar156 < 0x100) * (char)uVar156 - (0xff < uVar156);
      auVar104[6] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
      auVar104[7] = (uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119);
      auVar104[8] = (uVar134 != 0) * (uVar134 < 0x100) * (char)uVar134 - (0xff < uVar134);
      auVar104[9] = (uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124);
      auVar104[10] = (uVar126 != 0) * (uVar126 < 0x100) * (char)uVar126 - (0xff < uVar126);
      auVar104[0xb] = (uVar128 != 0) * (uVar128 < 0x100) * (char)uVar128 - (0xff < uVar128);
      auVar104[0xc] = (uVar130 != 0) * (uVar130 < 0x100) * (char)uVar130 - (0xff < uVar130);
      auVar104[0xd] = (uVar132 != 0) * (uVar132 < 0x100) * (char)uVar132 - (0xff < uVar132);
      auVar104[0xe] = (uVar135 != 0) * (uVar135 < 0x100) * (char)uVar135 - (0xff < uVar135);
      auVar104[0xf] = (uVar137 != 0) * (uVar137 < 0x100) * (char)uVar137 - (0xff < uVar137);
      auVar103 = psllw(auVar313,2);
      sVar175 = sVar175 - uVar326;
      sVar180 = sVar180 - sVar329;
      sVar184 = sVar184 - sVar330;
      sVar188 = sVar188 - sVar331;
      sVar192 = sVar192 - sVar332;
      sVar196 = sVar196 - sVar333;
      sVar200 = sVar200 - sVar334;
      sVar202 = sVar202 - uVar158;
      auVar178 = psllw(auVar208,2);
      sVar177 = (sVar176 - uVar223) - uVar206;
      sVar182 = (sVar181 - uVar227) - uStack_c6;
      sVar186 = (sVar185 - uVar228) - uStack_c4;
      sVar190 = (sVar189 - uVar229) - uStack_c2;
      sVar194 = (sVar193 - uVar230) - uStack_c0;
      sVar198 = (sVar197 - uVar231) - uStack_be;
      sVar235 = (sVar201 - uVar232) - uStack_bc;
      sVar238 = (sVar203 - uVar233) - uStack_ba;
      uStack_56 = (ushort)bVar270;
      uStack_54 = (ushort)bVar271;
      uStack_52 = (ushort)bVar274;
      uStack_50 = (ushort)bVar275;
      uStack_4e = (ushort)bVar278;
      uStack_4c = (ushort)bVar280;
      uStack_4a = (ushort)bVar283;
      uVar136 = (ushort)(uVar326 + uVar120 + uVar152 + auVar103._0_2_ + sVar177) >> 4;
      uVar119 = (ushort)(sVar329 + sVar123 + sStack_116 + auVar103._2_2_ + sVar182) >> 4;
      uVar122 = (ushort)(sVar330 + sVar125 + sStack_114 + auVar103._4_2_ + sVar186) >> 4;
      uVar151 = (ushort)(sVar331 + sVar127 + sStack_112 + auVar103._6_2_ + sVar190) >> 4;
      uVar154 = (ushort)(sVar332 + sVar129 + sStack_110 + auVar103._8_2_ + sVar194) >> 4;
      uVar155 = (ushort)(sVar333 + sVar131 + sStack_10e + auVar103._10_2_ + sVar198) >> 4;
      uVar156 = (ushort)(sVar334 + sVar133 + sStack_10c + auVar103._12_2_ + sVar235) >> 4;
      uVar157 = (ushort)(uVar158 + uVar139 + uVar148 + auVar103._14_2_ + sVar238) >> 4;
      uVar134 = (ushort)(uVar206 + uVar223 + uVar207 + auVar178._0_2_ + sVar175) >> 4;
      uVar124 = (ushort)(uStack_c6 + uVar227 + uStack_56 + auVar178._2_2_ + sVar180) >> 4;
      uVar126 = (ushort)(uStack_c4 + uVar228 + uStack_54 + auVar178._4_2_ + sVar184) >> 4;
      uVar128 = (ushort)(uStack_c2 + uVar229 + uStack_52 + auVar178._6_2_ + sVar188) >> 4;
      uVar130 = (ushort)(uStack_c0 + uVar230 + uStack_50 + auVar178._8_2_ + sVar192) >> 4;
      uVar132 = (ushort)(uStack_be + uVar231 + uStack_4e + auVar178._10_2_ + sVar196) >> 4;
      uVar135 = (ushort)(uStack_bc + uVar232 + uStack_4c + auVar178._12_2_ + sVar200) >> 4;
      uVar137 = (ushort)(uStack_ba + uVar233 + uStack_4a + auVar178._14_2_ + sVar202) >> 4;
      auVar237[1] = (uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119);
      auVar237[0] = (uVar136 != 0) * (uVar136 < 0x100) * (char)uVar136 - (0xff < uVar136);
      auVar237[2] = (uVar122 != 0) * (uVar122 < 0x100) * (char)uVar122 - (0xff < uVar122);
      auVar237[3] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
      auVar237[4] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
      auVar237[5] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar155 - (0xff < uVar155);
      auVar237[6] = (uVar156 != 0) * (uVar156 < 0x100) * (char)uVar156 - (0xff < uVar156);
      auVar237[7] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
      auVar237[8] = (uVar134 != 0) * (uVar134 < 0x100) * (char)uVar134 - (0xff < uVar134);
      auVar237[9] = (uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124);
      auVar237[10] = (uVar126 != 0) * (uVar126 < 0x100) * (char)uVar126 - (0xff < uVar126);
      auVar237[0xb] = (uVar128 != 0) * (uVar128 < 0x100) * (char)uVar128 - (0xff < uVar128);
      auVar237[0xc] = (uVar130 != 0) * (uVar130 < 0x100) * (char)uVar130 - (0xff < uVar130);
      auVar237[0xd] = (uVar132 != 0) * (uVar132 < 0x100) * (char)uVar132 - (0xff < uVar132);
      auVar237[0xe] = (uVar135 != 0) * (uVar135 < 0x100) * (char)uVar135 - (0xff < uVar135);
      auVar237[0xf] = (uVar137 != 0) * (uVar137 < 0x100) * (char)uVar137 - (0xff < uVar137);
      sVar177 = sVar177 - uVar207;
      sVar182 = sVar182 - uStack_56;
      sVar186 = sVar186 - uStack_54;
      sVar190 = sVar190 - uStack_52;
      sVar194 = sVar194 - uStack_50;
      sVar198 = sVar198 - uStack_4e;
      sVar235 = sVar235 - uStack_4c;
      sVar238 = sVar238 - uStack_4a;
      sVar175 = sVar175 - uVar152;
      sVar180 = sVar180 - sStack_116;
      sVar184 = sVar184 - sStack_114;
      sVar188 = sVar188 - sStack_112;
      sVar192 = sVar192 - sStack_110;
      sVar196 = sVar196 - sStack_10e;
      sVar200 = sVar200 - sStack_10c;
      sVar202 = sVar202 - uVar148;
      uStack_106 = (ushort)bVar279;
      uStack_104 = (ushort)bVar159;
      uStack_102 = (ushort)bVar168;
      uStack_100 = (ushort)bVar169;
      uStack_fe = (ushort)bVar170;
      uStack_fc = (ushort)bVar171;
      uStack_fa = (ushort)bVar172;
      uVar136 = (ushort)(uVar326 + uVar120 + uVar236 + auVar313._0_2_ * 5 + sVar177) >> 4;
      uVar119 = (ushort)(sVar329 + sVar123 + sVar239 + sVar264 * 5 + sVar182) >> 4;
      uVar148 = (ushort)(sVar330 + sVar125 + sVar241 + sVar268 * 5 + sVar186) >> 4;
      uVar152 = (ushort)(sVar331 + sVar127 + sVar243 + sVar272 * 5 + sVar190) >> 4;
      uVar122 = (ushort)(sVar332 + sVar129 + sVar245 + sVar276 * 5 + sVar194) >> 4;
      uVar151 = (ushort)(sVar333 + sVar131 + sVar247 + sVar281 * 5 + sVar198) >> 4;
      uVar154 = (ushort)(sVar334 + sVar133 + sVar249 + sVar285 * 5 + sVar235) >> 4;
      uVar158 = (ushort)(uVar158 + uVar139 + (uVar204 >> 8) + uVar144 * 5 + sVar238) >> 4;
      uVar155 = (ushort)(uVar206 + uVar223 + uVar147 + auVar208._0_2_ * 5 + sVar175) >> 4;
      uVar156 = (ushort)(uStack_c6 + uVar227 + uStack_106 + uVar292 * 5 + sVar180) >> 4;
      uVar157 = (ushort)(uStack_c4 + uVar228 + uStack_104 + uVar298 * 5 + sVar184) >> 4;
      uVar134 = (ushort)(uStack_c2 + uVar229 + uStack_102 + uVar300 * 5 + sVar188) >> 4;
      uVar124 = (ushort)(uStack_c0 + uVar230 + uStack_100 + uVar302 * 5 + sVar192) >> 4;
      uVar206 = (ushort)(uStack_be + uVar231 + uStack_fe + uVar304 * 5 + sVar196) >> 4;
      uVar207 = (ushort)(uStack_bc + uVar232 + uStack_fc + uVar306 * 5 + sVar200) >> 4;
      uVar126 = (ushort)(uStack_ba + uVar233 + uStack_fa + uVar308 * 5 + sVar202) >> 4;
      auVar140[1] = (uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119);
      auVar140[0] = (uVar136 != 0) * (uVar136 < 0x100) * (char)uVar136 - (0xff < uVar136);
      auVar140[2] = (uVar148 != 0) * (uVar148 < 0x100) * (char)uVar148 - (0xff < uVar148);
      auVar140[3] = (uVar152 != 0) * (uVar152 < 0x100) * (char)uVar152 - (0xff < uVar152);
      auVar140[4] = (uVar122 != 0) * (uVar122 < 0x100) * (char)uVar122 - (0xff < uVar122);
      auVar140[5] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
      auVar140[6] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
      auVar140[7] = (uVar158 != 0) * (uVar158 < 0x100) * (char)uVar158 - (0xff < uVar158);
      auVar140[8] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar155 - (0xff < uVar155);
      auVar140[9] = (uVar156 != 0) * (uVar156 < 0x100) * (char)uVar156 - (0xff < uVar156);
      auVar140[10] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
      auVar140[0xb] = (uVar134 != 0) * (uVar134 < 0x100) * (char)uVar134 - (0xff < uVar134);
      auVar140[0xc] = (uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124);
      auVar140[0xd] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
      auVar140[0xe] = (uVar207 != 0) * (uVar207 < 0x100) * (char)uVar207 - (0xff < uVar207);
      auVar140[0xf] = (uVar126 != 0) * (uVar126 < 0x100) * (char)uVar126 - (0xff < uVar126);
      uVar158 = (ushort)((uVar120 - uVar311) + uVar236 + auVar313._0_2_ * 7 + sVar177) >> 4;
      uVar136 = (ushort)((sVar123 - uStack_126) + sVar239 + sVar264 * 7 + sVar182) >> 4;
      uVar119 = (ushort)((sVar125 - uStack_124) + sVar241 + sVar268 * 7 + sVar186) >> 4;
      uVar148 = (ushort)((sVar127 - uStack_122) + sVar243 + sVar272 * 7 + sVar190) >> 4;
      uVar152 = (ushort)((sVar129 - uStack_120) + sVar245 + sVar276 * 7 + sVar194) >> 4;
      uVar122 = (ushort)((sVar131 - uStack_11e) + sVar247 + sVar281 * 7 + sVar198) >> 4;
      uVar151 = (ushort)((sVar133 - uStack_11c) + sVar249 + sVar285 * 7 + sVar235) >> 4;
      uVar204 = (ushort)((uVar139 - uStack_11a) + (uVar204 >> 8) + uVar144 * 7 + sVar238) >> 4;
      uVar224 = (ushort)((uVar223 - uVar224) + uVar147 + auVar208._0_2_ * 7 + sVar175) >> 4;
      uVar139 = (ushort)((uVar227 - sVar179) + uStack_106 + uVar292 * 7 + sVar180) >> 4;
      uVar144 = (ushort)(((ushort)bVar113 - sVar183) + uStack_104 + uVar298 * 7 + sVar184) >> 4;
      uVar147 = (ushort)(((ushort)bVar115 - sVar187) + uStack_102 + uVar300 * 7 + sVar188) >> 4;
      uVar154 = (ushort)(((ushort)bVar284 - sVar191) + uStack_100 + uVar302 * 7 + sVar192) >> 4;
      uVar155 = (ushort)(((ushort)bVar288 - sVar195) + uStack_fe + uVar304 * 7 + sVar196) >> 4;
      uVar156 = (ushort)(((ushort)bVar315 - sVar199) + uStack_fc + uVar306 * 7 + sVar200) >> 4;
      uVar234 = (ushort)(((ushort)bVar317 - (uVar234 >> 8)) + uStack_fa + uVar308 * 7 + sVar202) >>
                4;
      auVar121[1] = (uVar136 != 0) * (uVar136 < 0x100) * (char)uVar136 - (0xff < uVar136);
      auVar121[0] = (uVar158 != 0) * (uVar158 < 0x100) * (char)uVar158 - (0xff < uVar158);
      auVar121[2] = (uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119);
      auVar121[3] = (uVar148 != 0) * (uVar148 < 0x100) * (char)uVar148 - (0xff < uVar148);
      auVar121[4] = (uVar152 != 0) * (uVar152 < 0x100) * (char)uVar152 - (0xff < uVar152);
      auVar121[5] = (uVar122 != 0) * (uVar122 < 0x100) * (char)uVar122 - (0xff < uVar122);
      auVar121[6] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
      auVar121[7] = (uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204);
      auVar121[8] = (uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 - (0xff < uVar224);
      auVar121[9] = (uVar139 != 0) * (uVar139 < 0x100) * (char)uVar139 - (0xff < uVar139);
      auVar121[10] = (uVar144 != 0) * (uVar144 < 0x100) * (char)uVar144 - (0xff < uVar144);
      auVar121[0xb] = (uVar147 != 0) * (uVar147 < 0x100) * (char)uVar147 - (0xff < uVar147);
      auVar121[0xc] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
      auVar121[0xd] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar155 - (0xff < uVar155);
      auVar121[0xe] = (uVar156 != 0) * (uVar156 < 0x100) * (char)uVar156 - (0xff < uVar156);
      auVar121[0xf] = (uVar234 != 0) * (uVar234 < 0x100) * (char)uVar234 - (0xff < uVar234);
      local_178 = auVar121 & auVar100 | ~auVar100 & local_178;
      auVar141 = auVar140 & auVar100 | ~auVar100 & auVar141;
      local_168 = auVar237 & auVar100 | ~auVar100 & local_168;
      auVar328 = auVar104 & auVar100 | ~auVar100 & auVar328;
      auVar260 = auVar261 & auVar100 | ~auVar100 & auVar260;
      auVar295 = auVar296 & auVar100 | ~auVar100 & auVar295;
    }
  }
  *(long *)(s + -lVar98) = auVar295._0_8_;
  *(long *)s = auVar295._8_8_;
  *(long *)(s + lVar98 * -2) = auVar260._0_8_;
  *(long *)(s + lVar98) = auVar260._8_8_;
  *(long *)(s + lVar98 * -3) = auVar328._0_8_;
  *(long *)(s + lVar98 * 2) = auVar328._8_8_;
  *(undefined8 *)(s + lVar98 * -4) = local_168._0_8_;
  *(undefined8 *)(s + lVar98 * 3) = local_168._8_8_;
  *(long *)(s + lVar98 * -5) = auVar141._0_8_;
  *(long *)(s + lVar98 * 4) = auVar141._8_8_;
  *(long *)(s + lVar98 * -6) = local_178._0_8_;
  *(long *)(s + lVar98 * 5) = local_178._8_8_;
  return;
}

Assistant:

void aom_lpf_horizontal_14_dual_sse2(unsigned char *s, int p,
                                     const unsigned char *_blimit0,
                                     const unsigned char *_limit0,
                                     const unsigned char *_thresh0,
                                     const unsigned char *_blimit1,
                                     const unsigned char *_limit1,
                                     const unsigned char *_thresh1) {
  __m128i q6p6, q5p5, q4p4, q3p3, q2p2, q1p1, q0p0;
  __m128i blimit =
      _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_blimit0),
                         _mm_load_si128((const __m128i *)_blimit1));
  __m128i limit = _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_limit0),
                                     _mm_load_si128((const __m128i *)_limit1));
  __m128i thresh =
      _mm_unpacklo_epi32(_mm_load_si128((const __m128i *)_thresh0),
                         _mm_load_si128((const __m128i *)_thresh1));

  q4p4 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 5 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 4 * p)));
  q3p3 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 4 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 3 * p)));
  q2p2 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 3 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 2 * p)));
  q1p1 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 2 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 1 * p)));

  q0p0 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 1 * p)),
                            _mm_loadl_epi64((__m128i *)(s - 0 * p)));

  q5p5 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 6 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 5 * p)));

  q6p6 = _mm_unpacklo_epi64(_mm_loadl_epi64((__m128i *)(s - 7 * p)),
                            _mm_loadl_epi64((__m128i *)(s + 6 * p)));

  lpf_internal_14_dual_sse2(&q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1, &q0p0,
                            &blimit, &limit, &thresh);

  _mm_storel_epi64((__m128i *)(s - 1 * p), q0p0);
  _mm_storel_epi64((__m128i *)(s + 0 * p), _mm_srli_si128(q0p0, 8));
  _mm_storel_epi64((__m128i *)(s - 2 * p), q1p1);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1p1, 8));
  _mm_storel_epi64((__m128i *)(s - 3 * p), q2p2);
  _mm_storel_epi64((__m128i *)(s + 2 * p), _mm_srli_si128(q2p2, 8));
  _mm_storel_epi64((__m128i *)(s - 4 * p), q3p3);
  _mm_storel_epi64((__m128i *)(s + 3 * p), _mm_srli_si128(q3p3, 8));
  _mm_storel_epi64((__m128i *)(s - 5 * p), q4p4);
  _mm_storel_epi64((__m128i *)(s + 4 * p), _mm_srli_si128(q4p4, 8));
  _mm_storel_epi64((__m128i *)(s - 6 * p), q5p5);
  _mm_storel_epi64((__m128i *)(s + 5 * p), _mm_srli_si128(q5p5, 8));
}